

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_16,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<16,_embree::avx512::QuadMiMBIntersectorKPluecker<4,_16,_true>_>,_true>
     ::occluded(vint<16> *valid_i,Intersectors *This,RayK<16> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  Geometry *pGVar4;
  RTCRayQueryContext *pRVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  byte bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  ulong uVar23;
  ulong uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  size_t k;
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  bool bVar48;
  ushort uVar49;
  uint uVar50;
  AABBNodeMB4D *node1;
  ulong uVar51;
  ushort uVar53;
  long lVar54;
  undefined1 (*pauVar55) [64];
  long lVar56;
  ulong *puVar57;
  NodeRef root;
  vuint<4> *v;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  int iVar61;
  undefined1 auVar65 [32];
  undefined1 auVar64 [16];
  int iVar102;
  int iVar103;
  int iVar105;
  int iVar106;
  int iVar107;
  int iVar109;
  int iVar110;
  int iVar111;
  int iVar112;
  int iVar113;
  int iVar114;
  int iVar115;
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  int iVar104;
  undefined1 auVar62 [16];
  int iVar108;
  int iVar116;
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar63 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar117 [64];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM8 [64];
  undefined1 in_ZMM9 [64];
  undefined1 in_ZMM14 [64];
  undefined1 in_ZMM15 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM25 [64];
  Precalculations pre;
  vint<16> itime;
  QuadMesh *mesh;
  Vec3<embree::vfloat_impl<16>_> p1;
  Vec3<embree::vfloat_impl<16>_> p0;
  TravRayK<16,_true> tray;
  NodeRef stack_node [561];
  vfloat<16> stack_near [561];
  uint local_a864;
  ushort local_a85c;
  Precalculations local_a839;
  long local_a838;
  ulong local_a830;
  long local_a828;
  ulong local_a820;
  ulong local_a818;
  RayK<16> *local_a810;
  uint local_a804;
  undefined1 local_a800 [16];
  RTCRayQueryContext *pRStack_a7f0;
  RayK<16> *pRStack_a7e8;
  undefined1 *puStack_a7e0;
  undefined4 uStack_a7d8;
  undefined1 auStack_a7d4 [20];
  undefined1 (*local_a7b8) [32];
  Geometry *local_a7b0;
  BVH *local_a7a8;
  Intersectors *local_a7a0;
  RTCRayQueryContext *local_a798;
  ulong local_a790;
  ulong local_a788;
  undefined1 local_a780 [64];
  undefined1 local_a740 [64];
  undefined1 local_a700 [64];
  undefined1 local_a6c0 [64];
  undefined1 local_a680 [64];
  undefined1 local_a640 [64];
  undefined1 local_a600 [64];
  undefined1 local_a5c0 [64];
  undefined1 local_a580 [64];
  undefined1 local_a540 [64];
  undefined1 local_a500 [64];
  undefined1 local_a4c0 [64];
  undefined1 local_a480 [64];
  undefined1 local_a440 [64];
  undefined1 local_a400 [64];
  undefined1 local_a3c0 [64];
  undefined1 local_a380 [64];
  undefined1 local_a340 [64];
  undefined1 local_a300 [64];
  anon_union_192_2_4062524c_for_Vec3<embree::vfloat_impl<16>_>_1 local_a2c0;
  undefined1 local_a200 [64];
  undefined1 local_a1c0 [64];
  undefined1 local_a180 [64];
  undefined1 local_a140 [64];
  undefined1 local_a100 [64];
  undefined1 local_a0c0 [64];
  undefined1 local_a080 [64];
  undefined1 local_a040 [64];
  undefined1 local_a000 [64];
  uint local_9fc0;
  uint uStack_9fbc;
  uint uStack_9fb8;
  uint uStack_9fb4;
  uint uStack_9fb0;
  uint uStack_9fac;
  uint uStack_9fa8;
  uint uStack_9fa4;
  uint uStack_9fa0;
  uint uStack_9f9c;
  uint uStack_9f98;
  uint uStack_9f94;
  uint uStack_9f90;
  uint uStack_9f8c;
  uint uStack_9f88;
  uint uStack_9f84;
  undefined1 local_9f80 [64];
  undefined1 local_9f40 [64];
  undefined1 local_9f00 [64];
  undefined1 local_9ec0 [64];
  undefined8 local_9e50;
  size_t local_9e48;
  ulong local_9e40 [560];
  undefined1 local_8cc0 [64];
  uint local_8c80;
  uint uStack_8c7c;
  uint uStack_8c78;
  uint uStack_8c74;
  uint uStack_8c70;
  uint uStack_8c6c;
  uint uStack_8c68;
  uint uStack_8c64;
  uint uStack_8c60;
  uint uStack_8c5c;
  uint uStack_8c58;
  uint uStack_8c54;
  uint uStack_8c50;
  uint uStack_8c4c;
  uint uStack_8c48;
  uint uStack_8c44;
  undefined1 local_8c40 [35856];
  ulong uVar52;
  undefined1 auVar98 [64];
  
  local_9e48 = (((BVH *)This->ptr)->root).ptr;
  if (local_9e48 != 8) {
    auVar66 = vpternlogd_avx512f(in_ZMM2,in_ZMM2,in_ZMM2,0xff);
    auVar117 = ZEXT1664(ZEXT816(0) << 0x40);
    uVar59 = vcmpps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar117,5);
    uVar58 = vpcmpeqd_avx512f(auVar66,(undefined1  [64])valid_i->field_0);
    uVar59 = uVar59 & uVar58;
    if ((ushort)uVar59 != 0) {
      local_a7a8 = (BVH *)This->ptr;
      local_a7a0 = This;
      local_a2c0._0_8_ = *(undefined8 *)ray;
      local_a2c0._8_8_ = *(undefined8 *)(ray + 8);
      local_a2c0._16_8_ = *(undefined8 *)(ray + 0x10);
      local_a2c0._24_8_ = *(undefined8 *)(ray + 0x18);
      local_a2c0._32_8_ = *(undefined8 *)(ray + 0x20);
      local_a2c0._40_8_ = *(undefined8 *)(ray + 0x28);
      local_a2c0._48_8_ = *(undefined8 *)(ray + 0x30);
      local_a2c0._56_8_ = *(undefined8 *)(ray + 0x38);
      local_a2c0._64_8_ = *(undefined8 *)(ray + 0x40);
      local_a2c0._72_8_ = *(undefined8 *)(ray + 0x48);
      local_a2c0._80_8_ = *(undefined8 *)(ray + 0x50);
      local_a2c0._88_8_ = *(undefined8 *)(ray + 0x58);
      local_a2c0._96_8_ = *(undefined8 *)(ray + 0x60);
      local_a2c0._104_8_ = *(undefined8 *)(ray + 0x68);
      local_a2c0._112_8_ = *(undefined8 *)(ray + 0x70);
      local_a2c0._120_8_ = *(undefined8 *)(ray + 0x78);
      local_a2c0._128_8_ = *(undefined8 *)(ray + 0x80);
      local_a2c0._136_8_ = *(undefined8 *)(ray + 0x88);
      local_a2c0._144_8_ = *(undefined8 *)(ray + 0x90);
      local_a2c0._152_8_ = *(undefined8 *)(ray + 0x98);
      local_a2c0._160_8_ = *(undefined8 *)(ray + 0xa0);
      local_a2c0._168_8_ = *(undefined8 *)(ray + 0xa8);
      local_a2c0._176_8_ = *(undefined8 *)(ray + 0xb0);
      local_a2c0._184_8_ = *(undefined8 *)(ray + 0xb8);
      local_a200 = *(undefined1 (*) [64])(ray + 0x100);
      local_a1c0 = *(undefined1 (*) [64])(ray + 0x140);
      local_a180 = *(undefined1 (*) [64])(ray + 0x180);
      auVar67 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
      auVar66 = vandps_avx512dq(local_a200,auVar67);
      auVar68 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
      uVar58 = vcmpps_avx512f(auVar66,auVar68,1);
      auVar69 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar66 = vdivps_avx512f(auVar69,local_a200);
      auVar70 = vdivps_avx512f(auVar69,local_a1c0);
      auVar71 = vandps_avx512dq(local_a1c0,auVar67);
      uVar51 = vcmpps_avx512f(auVar71,auVar68,1);
      auVar71 = vandps_avx512dq(local_a180,auVar67);
      auVar72 = vdivps_avx512f(auVar69,local_a180);
      uVar52 = vcmpps_avx512f(auVar71,auVar68,1);
      auVar68 = vbroadcastss_avx512f(ZEXT416(0x5d5e0b6b));
      bVar48 = (bool)((byte)uVar58 & 1);
      iVar61 = auVar68._0_4_;
      local_a140._0_4_ = (uint)bVar48 * iVar61 | (uint)!bVar48 * auVar66._0_4_;
      bVar48 = (bool)((byte)(uVar58 >> 1) & 1);
      iVar102 = auVar68._4_4_;
      local_a140._4_4_ = (uint)bVar48 * iVar102 | (uint)!bVar48 * auVar66._4_4_;
      bVar48 = (bool)((byte)(uVar58 >> 2) & 1);
      iVar103 = auVar68._8_4_;
      local_a140._8_4_ = (uint)bVar48 * iVar103 | (uint)!bVar48 * auVar66._8_4_;
      bVar48 = (bool)((byte)(uVar58 >> 3) & 1);
      iVar104 = auVar68._12_4_;
      local_a140._12_4_ = (uint)bVar48 * iVar104 | (uint)!bVar48 * auVar66._12_4_;
      bVar48 = (bool)((byte)(uVar58 >> 4) & 1);
      iVar105 = auVar68._16_4_;
      local_a140._16_4_ = (uint)bVar48 * iVar105 | (uint)!bVar48 * auVar66._16_4_;
      bVar48 = (bool)((byte)(uVar58 >> 5) & 1);
      iVar106 = auVar68._20_4_;
      local_a140._20_4_ = (uint)bVar48 * iVar106 | (uint)!bVar48 * auVar66._20_4_;
      bVar48 = (bool)((byte)(uVar58 >> 6) & 1);
      iVar107 = auVar68._24_4_;
      local_a140._24_4_ = (uint)bVar48 * iVar107 | (uint)!bVar48 * auVar66._24_4_;
      bVar48 = (bool)((byte)(uVar58 >> 7) & 1);
      iVar108 = auVar68._28_4_;
      local_a140._28_4_ = (uint)bVar48 * iVar108 | (uint)!bVar48 * auVar66._28_4_;
      bVar48 = (bool)((byte)(uVar58 >> 8) & 1);
      iVar109 = auVar68._32_4_;
      local_a140._32_4_ = (uint)bVar48 * iVar109 | (uint)!bVar48 * auVar66._32_4_;
      bVar48 = (bool)((byte)(uVar58 >> 9) & 1);
      iVar110 = auVar68._36_4_;
      local_a140._36_4_ = (uint)bVar48 * iVar110 | (uint)!bVar48 * auVar66._36_4_;
      bVar48 = (bool)((byte)(uVar58 >> 10) & 1);
      iVar111 = auVar68._40_4_;
      local_a140._40_4_ = (uint)bVar48 * iVar111 | (uint)!bVar48 * auVar66._40_4_;
      bVar48 = (bool)((byte)(uVar58 >> 0xb) & 1);
      iVar112 = auVar68._44_4_;
      local_a140._44_4_ = (uint)bVar48 * iVar112 | (uint)!bVar48 * auVar66._44_4_;
      bVar48 = (bool)((byte)(uVar58 >> 0xc) & 1);
      iVar113 = auVar68._48_4_;
      local_a140._48_4_ = (uint)bVar48 * iVar113 | (uint)!bVar48 * auVar66._48_4_;
      bVar48 = (bool)((byte)(uVar58 >> 0xd) & 1);
      iVar114 = auVar68._52_4_;
      local_a140._52_4_ = (uint)bVar48 * iVar114 | (uint)!bVar48 * auVar66._52_4_;
      bVar48 = (bool)((byte)(uVar58 >> 0xe) & 1);
      iVar115 = auVar68._56_4_;
      iVar116 = auVar68._60_4_;
      local_a140._56_4_ = (uint)bVar48 * iVar115 | (uint)!bVar48 * auVar66._56_4_;
      bVar48 = SUB81(uVar58 >> 0xf,0);
      local_a140._60_4_ = (uint)bVar48 * iVar116 | (uint)!bVar48 * auVar66._60_4_;
      bVar48 = (bool)((byte)uVar51 & 1);
      local_a100._0_4_ = (uint)bVar48 * iVar61 | (uint)!bVar48 * auVar70._0_4_;
      bVar48 = (bool)((byte)(uVar51 >> 1) & 1);
      local_a100._4_4_ = (uint)bVar48 * iVar102 | (uint)!bVar48 * auVar70._4_4_;
      bVar48 = (bool)((byte)(uVar51 >> 2) & 1);
      local_a100._8_4_ = (uint)bVar48 * iVar103 | (uint)!bVar48 * auVar70._8_4_;
      bVar48 = (bool)((byte)(uVar51 >> 3) & 1);
      local_a100._12_4_ = (uint)bVar48 * iVar104 | (uint)!bVar48 * auVar70._12_4_;
      bVar48 = (bool)((byte)(uVar51 >> 4) & 1);
      local_a100._16_4_ = (uint)bVar48 * iVar105 | (uint)!bVar48 * auVar70._16_4_;
      bVar48 = (bool)((byte)(uVar51 >> 5) & 1);
      local_a100._20_4_ = (uint)bVar48 * iVar106 | (uint)!bVar48 * auVar70._20_4_;
      bVar48 = (bool)((byte)(uVar51 >> 6) & 1);
      local_a100._24_4_ = (uint)bVar48 * iVar107 | (uint)!bVar48 * auVar70._24_4_;
      bVar48 = (bool)((byte)(uVar51 >> 7) & 1);
      local_a100._28_4_ = (uint)bVar48 * iVar108 | (uint)!bVar48 * auVar70._28_4_;
      bVar48 = (bool)((byte)(uVar51 >> 8) & 1);
      local_a100._32_4_ = (uint)bVar48 * iVar109 | (uint)!bVar48 * auVar70._32_4_;
      bVar48 = (bool)((byte)(uVar51 >> 9) & 1);
      local_a100._36_4_ = (uint)bVar48 * iVar110 | (uint)!bVar48 * auVar70._36_4_;
      bVar48 = (bool)((byte)(uVar51 >> 10) & 1);
      local_a100._40_4_ = (uint)bVar48 * iVar111 | (uint)!bVar48 * auVar70._40_4_;
      bVar48 = (bool)((byte)(uVar51 >> 0xb) & 1);
      local_a100._44_4_ = (uint)bVar48 * iVar112 | (uint)!bVar48 * auVar70._44_4_;
      bVar48 = (bool)((byte)(uVar51 >> 0xc) & 1);
      local_a100._48_4_ = (uint)bVar48 * iVar113 | (uint)!bVar48 * auVar70._48_4_;
      bVar48 = (bool)((byte)(uVar51 >> 0xd) & 1);
      local_a100._52_4_ = (uint)bVar48 * iVar114 | (uint)!bVar48 * auVar70._52_4_;
      bVar48 = (bool)((byte)(uVar51 >> 0xe) & 1);
      local_a100._56_4_ = (uint)bVar48 * iVar115 | (uint)!bVar48 * auVar70._56_4_;
      bVar48 = SUB81(uVar51 >> 0xf,0);
      local_a100._60_4_ = (uint)bVar48 * iVar116 | (uint)!bVar48 * auVar70._60_4_;
      bVar48 = (bool)((byte)uVar52 & 1);
      local_a0c0._0_4_ = (uint)bVar48 * iVar61 | (uint)!bVar48 * auVar72._0_4_;
      bVar48 = (bool)((byte)(uVar52 >> 1) & 1);
      local_a0c0._4_4_ = (uint)bVar48 * iVar102 | (uint)!bVar48 * auVar72._4_4_;
      bVar48 = (bool)((byte)(uVar52 >> 2) & 1);
      local_a0c0._8_4_ = (uint)bVar48 * iVar103 | (uint)!bVar48 * auVar72._8_4_;
      bVar48 = (bool)((byte)(uVar52 >> 3) & 1);
      local_a0c0._12_4_ = (uint)bVar48 * iVar104 | (uint)!bVar48 * auVar72._12_4_;
      bVar48 = (bool)((byte)(uVar52 >> 4) & 1);
      local_a0c0._16_4_ = (uint)bVar48 * iVar105 | (uint)!bVar48 * auVar72._16_4_;
      bVar48 = (bool)((byte)(uVar52 >> 5) & 1);
      local_a0c0._20_4_ = (uint)bVar48 * iVar106 | (uint)!bVar48 * auVar72._20_4_;
      bVar48 = (bool)((byte)(uVar52 >> 6) & 1);
      local_a0c0._24_4_ = (uint)bVar48 * iVar107 | (uint)!bVar48 * auVar72._24_4_;
      bVar48 = (bool)((byte)(uVar52 >> 7) & 1);
      local_a0c0._28_4_ = (uint)bVar48 * iVar108 | (uint)!bVar48 * auVar72._28_4_;
      bVar48 = (bool)((byte)(uVar52 >> 8) & 1);
      local_a0c0._32_4_ = (uint)bVar48 * iVar109 | (uint)!bVar48 * auVar72._32_4_;
      bVar48 = (bool)((byte)(uVar52 >> 9) & 1);
      local_a0c0._36_4_ = (uint)bVar48 * iVar110 | (uint)!bVar48 * auVar72._36_4_;
      bVar48 = (bool)((byte)(uVar52 >> 10) & 1);
      local_a0c0._40_4_ = (uint)bVar48 * iVar111 | (uint)!bVar48 * auVar72._40_4_;
      bVar48 = (bool)((byte)(uVar52 >> 0xb) & 1);
      local_a0c0._44_4_ = (uint)bVar48 * iVar112 | (uint)!bVar48 * auVar72._44_4_;
      bVar48 = (bool)((byte)(uVar52 >> 0xc) & 1);
      local_a0c0._48_4_ = (uint)bVar48 * iVar113 | (uint)!bVar48 * auVar72._48_4_;
      bVar48 = (bool)((byte)(uVar52 >> 0xd) & 1);
      local_a0c0._52_4_ = (uint)bVar48 * iVar114 | (uint)!bVar48 * auVar72._52_4_;
      bVar48 = (bool)((byte)(uVar52 >> 0xe) & 1);
      local_a0c0._56_4_ = (uint)bVar48 * iVar115 | (uint)!bVar48 * auVar72._56_4_;
      bVar48 = SUB81(uVar52 >> 0xf,0);
      local_a0c0._60_4_ = (uint)bVar48 * iVar116 | (uint)!bVar48 * auVar72._60_4_;
      uVar58 = vcmpps_avx512f(local_a140,auVar117,1);
      auVar68 = vpbroadcastd_avx512f(ZEXT416(0x20));
      auVar66._4_4_ = (uint)((byte)(uVar58 >> 1) & 1) * auVar68._4_4_;
      auVar66._0_4_ = (uint)((byte)uVar58 & 1) * auVar68._0_4_;
      auVar66._8_4_ = (uint)((byte)(uVar58 >> 2) & 1) * auVar68._8_4_;
      auVar66._12_4_ = (uint)((byte)(uVar58 >> 3) & 1) * auVar68._12_4_;
      auVar66._16_4_ = (uint)((byte)(uVar58 >> 4) & 1) * auVar68._16_4_;
      auVar66._20_4_ = (uint)((byte)(uVar58 >> 5) & 1) * auVar68._20_4_;
      auVar66._24_4_ = (uint)((byte)(uVar58 >> 6) & 1) * auVar68._24_4_;
      auVar66._28_4_ = (uint)((byte)(uVar58 >> 7) & 1) * auVar68._28_4_;
      auVar66._32_4_ = (uint)((byte)(uVar58 >> 8) & 1) * auVar68._32_4_;
      auVar66._36_4_ = (uint)((byte)(uVar58 >> 9) & 1) * auVar68._36_4_;
      auVar66._40_4_ = (uint)((byte)(uVar58 >> 10) & 1) * auVar68._40_4_;
      auVar66._44_4_ = (uint)((byte)(uVar58 >> 0xb) & 1) * auVar68._44_4_;
      auVar66._48_4_ = (uint)((byte)(uVar58 >> 0xc) & 1) * auVar68._48_4_;
      auVar66._52_4_ = (uint)((byte)(uVar58 >> 0xd) & 1) * auVar68._52_4_;
      auVar66._56_4_ = (uint)((byte)(uVar58 >> 0xe) & 1) * auVar68._56_4_;
      auVar66._60_4_ = (uint)(byte)(uVar58 >> 0xf) * auVar68._60_4_;
      local_a080 = vmovdqa64_avx512f(auVar66);
      uVar58 = vcmpps_avx512f(local_a100,auVar117,5);
      auVar66 = vpbroadcastd_avx512f(ZEXT416(0x60));
      auVar70 = vpbroadcastd_avx512f(ZEXT416(0x40));
      bVar48 = (bool)((byte)uVar58 & 1);
      auVar68._0_4_ = (uint)bVar48 * auVar70._0_4_ | (uint)!bVar48 * auVar66._0_4_;
      bVar48 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar68._4_4_ = (uint)bVar48 * auVar70._4_4_ | (uint)!bVar48 * auVar66._4_4_;
      bVar48 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar68._8_4_ = (uint)bVar48 * auVar70._8_4_ | (uint)!bVar48 * auVar66._8_4_;
      bVar48 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar68._12_4_ = (uint)bVar48 * auVar70._12_4_ | (uint)!bVar48 * auVar66._12_4_;
      bVar48 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar68._16_4_ = (uint)bVar48 * auVar70._16_4_ | (uint)!bVar48 * auVar66._16_4_;
      bVar48 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar68._20_4_ = (uint)bVar48 * auVar70._20_4_ | (uint)!bVar48 * auVar66._20_4_;
      bVar48 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar68._24_4_ = (uint)bVar48 * auVar70._24_4_ | (uint)!bVar48 * auVar66._24_4_;
      bVar48 = (bool)((byte)(uVar58 >> 7) & 1);
      auVar68._28_4_ = (uint)bVar48 * auVar70._28_4_ | (uint)!bVar48 * auVar66._28_4_;
      bVar48 = (bool)((byte)(uVar58 >> 8) & 1);
      auVar68._32_4_ = (uint)bVar48 * auVar70._32_4_ | (uint)!bVar48 * auVar66._32_4_;
      bVar48 = (bool)((byte)(uVar58 >> 9) & 1);
      auVar68._36_4_ = (uint)bVar48 * auVar70._36_4_ | (uint)!bVar48 * auVar66._36_4_;
      bVar48 = (bool)((byte)(uVar58 >> 10) & 1);
      auVar68._40_4_ = (uint)bVar48 * auVar70._40_4_ | (uint)!bVar48 * auVar66._40_4_;
      bVar48 = (bool)((byte)(uVar58 >> 0xb) & 1);
      auVar68._44_4_ = (uint)bVar48 * auVar70._44_4_ | (uint)!bVar48 * auVar66._44_4_;
      bVar48 = (bool)((byte)(uVar58 >> 0xc) & 1);
      auVar68._48_4_ = (uint)bVar48 * auVar70._48_4_ | (uint)!bVar48 * auVar66._48_4_;
      bVar48 = (bool)((byte)(uVar58 >> 0xd) & 1);
      auVar68._52_4_ = (uint)bVar48 * auVar70._52_4_ | (uint)!bVar48 * auVar66._52_4_;
      bVar48 = (bool)((byte)(uVar58 >> 0xe) & 1);
      auVar68._56_4_ = (uint)bVar48 * auVar70._56_4_ | (uint)!bVar48 * auVar66._56_4_;
      bVar48 = SUB81(uVar58 >> 0xf,0);
      auVar68._60_4_ = (uint)bVar48 * auVar70._60_4_ | (uint)!bVar48 * auVar66._60_4_;
      local_a040 = vmovdqa64_avx512f(auVar68);
      uVar58 = vcmpps_avx512f(local_a0c0,auVar117,5);
      auVar66 = vpbroadcastd_avx512f(ZEXT416(0xa0));
      auVar68 = vpbroadcastd_avx512f(ZEXT416(0x80));
      bVar48 = (bool)((byte)uVar58 & 1);
      auVar70._0_4_ = (uint)bVar48 * auVar68._0_4_ | (uint)!bVar48 * auVar66._0_4_;
      bVar48 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar70._4_4_ = (uint)bVar48 * auVar68._4_4_ | (uint)!bVar48 * auVar66._4_4_;
      bVar48 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar70._8_4_ = (uint)bVar48 * auVar68._8_4_ | (uint)!bVar48 * auVar66._8_4_;
      bVar48 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar70._12_4_ = (uint)bVar48 * auVar68._12_4_ | (uint)!bVar48 * auVar66._12_4_;
      bVar48 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar70._16_4_ = (uint)bVar48 * auVar68._16_4_ | (uint)!bVar48 * auVar66._16_4_;
      bVar48 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar70._20_4_ = (uint)bVar48 * auVar68._20_4_ | (uint)!bVar48 * auVar66._20_4_;
      bVar48 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar70._24_4_ = (uint)bVar48 * auVar68._24_4_ | (uint)!bVar48 * auVar66._24_4_;
      bVar48 = (bool)((byte)(uVar58 >> 7) & 1);
      auVar70._28_4_ = (uint)bVar48 * auVar68._28_4_ | (uint)!bVar48 * auVar66._28_4_;
      bVar48 = (bool)((byte)(uVar58 >> 8) & 1);
      auVar70._32_4_ = (uint)bVar48 * auVar68._32_4_ | (uint)!bVar48 * auVar66._32_4_;
      bVar48 = (bool)((byte)(uVar58 >> 9) & 1);
      auVar70._36_4_ = (uint)bVar48 * auVar68._36_4_ | (uint)!bVar48 * auVar66._36_4_;
      bVar48 = (bool)((byte)(uVar58 >> 10) & 1);
      auVar70._40_4_ = (uint)bVar48 * auVar68._40_4_ | (uint)!bVar48 * auVar66._40_4_;
      bVar48 = (bool)((byte)(uVar58 >> 0xb) & 1);
      auVar70._44_4_ = (uint)bVar48 * auVar68._44_4_ | (uint)!bVar48 * auVar66._44_4_;
      bVar48 = (bool)((byte)(uVar58 >> 0xc) & 1);
      auVar70._48_4_ = (uint)bVar48 * auVar68._48_4_ | (uint)!bVar48 * auVar66._48_4_;
      bVar48 = (bool)((byte)(uVar58 >> 0xd) & 1);
      auVar70._52_4_ = (uint)bVar48 * auVar68._52_4_ | (uint)!bVar48 * auVar66._52_4_;
      bVar48 = (bool)((byte)(uVar58 >> 0xe) & 1);
      auVar70._56_4_ = (uint)bVar48 * auVar68._56_4_ | (uint)!bVar48 * auVar66._56_4_;
      bVar48 = SUB81(uVar58 >> 0xf,0);
      auVar70._60_4_ = (uint)bVar48 * auVar68._60_4_ | (uint)!bVar48 * auVar66._60_4_;
      local_a000 = vmovdqa64_avx512f(auVar70);
      local_8cc0 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
      local_a804 = (uint)uVar59;
      auVar66 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0xc0),auVar117);
      bVar48 = (bool)((byte)uVar59 & 1);
      local_9fc0 = (uint)bVar48 * auVar66._0_4_ | (uint)!bVar48 * local_8cc0._0_4_;
      bVar48 = (bool)((byte)(uVar59 >> 1) & 1);
      uStack_8c7c = (uint)bVar48 * auVar66._4_4_ | (uint)!bVar48 * local_8cc0._4_4_;
      bVar48 = (bool)((byte)(uVar59 >> 2) & 1);
      uStack_8c78 = (uint)bVar48 * auVar66._8_4_ | (uint)!bVar48 * local_8cc0._8_4_;
      bVar48 = (bool)((byte)(uVar59 >> 3) & 1);
      uStack_8c74 = (uint)bVar48 * auVar66._12_4_ | (uint)!bVar48 * local_8cc0._12_4_;
      bVar48 = (bool)((byte)(uVar59 >> 4) & 1);
      uStack_8c70 = (uint)bVar48 * auVar66._16_4_ | (uint)!bVar48 * local_8cc0._16_4_;
      bVar48 = (bool)((byte)(uVar59 >> 5) & 1);
      uStack_8c6c = (uint)bVar48 * auVar66._20_4_ | (uint)!bVar48 * local_8cc0._20_4_;
      bVar48 = (bool)((byte)(uVar59 >> 6) & 1);
      uStack_8c68 = (uint)bVar48 * auVar66._24_4_ | (uint)!bVar48 * local_8cc0._24_4_;
      bVar48 = (bool)((byte)(uVar59 >> 7) & 1);
      uStack_8c64 = (uint)bVar48 * auVar66._28_4_ | (uint)!bVar48 * local_8cc0._28_4_;
      bVar14 = (byte)(uVar59 >> 8);
      bVar48 = (bool)(bVar14 & 1);
      uStack_8c60 = (uint)bVar48 * auVar66._32_4_ | (uint)!bVar48 * local_8cc0._32_4_;
      bVar48 = (bool)((byte)(uVar59 >> 9) & 1);
      uStack_8c5c = (uint)bVar48 * auVar66._36_4_ | (uint)!bVar48 * local_8cc0._36_4_;
      bVar48 = (bool)((byte)(uVar59 >> 10) & 1);
      uStack_8c58 = (uint)bVar48 * auVar66._40_4_ | (uint)!bVar48 * local_8cc0._40_4_;
      bVar48 = (bool)((byte)(uVar59 >> 0xb) & 1);
      uStack_8c54 = (uint)bVar48 * auVar66._44_4_ | (uint)!bVar48 * local_8cc0._44_4_;
      bVar48 = (bool)((byte)(uVar59 >> 0xc) & 1);
      uStack_8c50 = (uint)bVar48 * auVar66._48_4_ | (uint)!bVar48 * local_8cc0._48_4_;
      bVar48 = (bool)((byte)(uVar59 >> 0xd) & 1);
      uStack_8c4c = (uint)bVar48 * auVar66._52_4_ | (uint)!bVar48 * local_8cc0._52_4_;
      bVar48 = (bool)((byte)(uVar59 >> 0xe) & 1);
      uStack_8c48 = (uint)bVar48 * auVar66._56_4_ | (uint)!bVar48 * local_8cc0._56_4_;
      bVar48 = SUB81(uVar59 >> 0xf,0);
      uStack_8c44 = (uint)bVar48 * auVar66._60_4_ | (uint)!bVar48 * local_8cc0._60_4_;
      uStack_9fbc = uStack_8c7c;
      uStack_9fb8 = uStack_8c78;
      uStack_9fb4 = uStack_8c74;
      uStack_9fb0 = uStack_8c70;
      uStack_9fac = uStack_8c6c;
      uStack_9fa8 = uStack_8c68;
      uStack_9fa4 = uStack_8c64;
      uStack_9fa0 = uStack_8c60;
      uStack_9f9c = uStack_8c5c;
      uStack_9f98 = uStack_8c58;
      uStack_9f94 = uStack_8c54;
      uStack_9f90 = uStack_8c50;
      uStack_9f8c = uStack_8c4c;
      uStack_9f88 = uStack_8c48;
      uStack_9f84 = uStack_8c44;
      auVar66 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      auVar117 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar117);
      bVar48 = (bool)((byte)uVar59 & 1);
      bVar7 = (bool)((byte)(uVar59 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar59 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar59 >> 3) & 1);
      bVar10 = (bool)((byte)(uVar59 >> 4) & 1);
      bVar11 = (bool)((byte)(uVar59 >> 5) & 1);
      bVar12 = (bool)((byte)(uVar59 >> 6) & 1);
      bVar13 = (bool)((byte)(uVar59 >> 7) & 1);
      bVar15 = (bool)(bVar14 & 1);
      bVar16 = (bool)((byte)(uVar59 >> 9) & 1);
      bVar17 = (bool)((byte)(uVar59 >> 10) & 1);
      bVar18 = (bool)((byte)(uVar59 >> 0xb) & 1);
      bVar19 = (bool)((byte)(uVar59 >> 0xc) & 1);
      bVar20 = (bool)((byte)(uVar59 >> 0xd) & 1);
      bVar21 = (bool)((byte)(uVar59 >> 0xe) & 1);
      bVar22 = SUB81(uVar59 >> 0xf,0);
      local_9f80._4_4_ = (uint)bVar7 * auVar117._4_4_ | (uint)!bVar7 * auVar66._4_4_;
      local_9f80._0_4_ = (uint)bVar48 * auVar117._0_4_ | (uint)!bVar48 * auVar66._0_4_;
      local_9f80._8_4_ = (uint)bVar8 * auVar117._8_4_ | (uint)!bVar8 * auVar66._8_4_;
      local_9f80._12_4_ = (uint)bVar9 * auVar117._12_4_ | (uint)!bVar9 * auVar66._12_4_;
      local_9f80._16_4_ = (uint)bVar10 * auVar117._16_4_ | (uint)!bVar10 * auVar66._16_4_;
      local_9f80._20_4_ = (uint)bVar11 * auVar117._20_4_ | (uint)!bVar11 * auVar66._20_4_;
      local_9f80._24_4_ = (uint)bVar12 * auVar117._24_4_ | (uint)!bVar12 * auVar66._24_4_;
      local_9f80._28_4_ = (uint)bVar13 * auVar117._28_4_ | (uint)!bVar13 * auVar66._28_4_;
      local_9f80._32_4_ = (uint)bVar15 * auVar117._32_4_ | (uint)!bVar15 * auVar66._32_4_;
      local_9f80._36_4_ = (uint)bVar16 * auVar117._36_4_ | (uint)!bVar16 * auVar66._36_4_;
      local_9f80._40_4_ = (uint)bVar17 * auVar117._40_4_ | (uint)!bVar17 * auVar66._40_4_;
      local_9f80._44_4_ = (uint)bVar18 * auVar117._44_4_ | (uint)!bVar18 * auVar66._44_4_;
      local_9f80._48_4_ = (uint)bVar19 * auVar117._48_4_ | (uint)!bVar19 * auVar66._48_4_;
      local_9f80._52_4_ = (uint)bVar20 * auVar117._52_4_ | (uint)!bVar20 * auVar66._52_4_;
      local_9f80._56_4_ = (uint)bVar21 * auVar117._56_4_ | (uint)!bVar21 * auVar66._56_4_;
      local_9f80._60_4_ = (uint)bVar22 * auVar117._60_4_ | (uint)!bVar22 * auVar66._60_4_;
      local_a864 = (uint)(ushort)~(ushort)uVar59;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar59 = 0xe;
      }
      else {
        uVar59 = 2;
        if ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT) {
          uVar59 = 0xe;
        }
      }
      local_a810 = ray + 0x200;
      puVar57 = local_9e40;
      local_9e50 = 0xfffffffffffffff8;
      pauVar55 = (undefined1 (*) [64])local_8c40;
      local_8c80 = local_9fc0;
      local_a7b8 = (undefined1 (*) [32])local_a440;
      auVar68 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
      auVar117 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
      auVar62 = vxorps_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
      auVar70 = ZEXT1664(auVar62);
      auVar66 = local_8cc0;
LAB_0082297c:
      do {
        do {
          root.ptr = puVar57[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_008240e3;
          puVar57 = puVar57 + -1;
          local_a780 = pauVar55[-1];
          pauVar55 = pauVar55 + -1;
          uVar58 = vcmpps_avx512f(local_a780,local_9f80,1);
        } while ((short)uVar58 == 0);
        uVar51 = CONCAT44(0,POPCOUNT((int)uVar58));
        if (uVar59 < uVar51) {
LAB_008229c4:
          do {
            lVar54 = -0x20;
            uVar58 = 8;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_008240e3;
              uVar25 = vcmpps_avx512f(local_a780,local_9f80,9);
              if ((short)uVar25 != 0) {
                local_a790 = (ulong)((uint)root.ptr & 0xf) - 8;
                uVar50 = local_a864;
                if (local_a790 != 0) {
                  uVar50 = ~local_a864;
                  uVar58 = 0;
                  do {
                    uVar52 = (ulong)uVar50;
                    lVar54 = uVar58 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                    local_a820 = 0;
                    local_a818 = uVar52 & 0xffff;
                    for (uVar51 = local_a818; (uVar51 & 1) == 0;
                        uVar51 = uVar51 >> 1 | 0x8000000000000000) {
                      local_a820 = local_a820 + 1;
                    }
                    lVar56 = 0;
                    local_a830 = uVar58;
                    do {
                      uVar53 = (ushort)uVar52;
                      auVar62 = auVar70._0_16_;
                      local_a85c = (ushort)uVar50;
                      if (*(int *)(lVar54 + 0x50 + lVar56 * 4) == -1) break;
                      local_a788 = (ulong)*(uint *)(lVar54 + 0x40 + lVar56 * 4);
                      local_a7b0 = (context->scene->geometries).items[local_a788].ptr;
                      auVar63._8_8_ = 0;
                      auVar63._0_4_ = (local_a7b0->time_range).lower;
                      auVar63._4_4_ = (local_a7b0->time_range).upper;
                      auVar71 = vbroadcastss_avx512f(auVar63);
                      auVar72 = vbroadcastss_avx512f(ZEXT416((uint)local_a7b0->fnumTimeSegments));
                      auVar71 = vsubps_avx512f(*(undefined1 (*) [64])(ray + 0x1c0),auVar71);
                      auVar64 = vmovshdup_avx(auVar63);
                      auVar63 = vsubps_avx(auVar64,auVar63);
                      auVar74 = vbroadcastss_avx512f(auVar63);
                      auVar71 = vdivps_avx512f(auVar71,auVar74);
                      auVar71 = vmulps_avx512f(auVar72,auVar71);
                      auVar74 = vrndscaleps_avx512f(auVar71,1);
                      auVar63 = vaddss_avx512f(auVar72._0_16_,SUB6416(ZEXT464(0xbf800000),0));
                      auVar72 = vbroadcastss_avx512f(auVar63);
                      auVar72 = vminps_avx512f(auVar74,auVar72);
                      auVar72 = vmaxps_avx512f(auVar72,auVar70);
                      auVar74 = vsubps_avx512f(auVar71,auVar72);
                      auVar73 = vcvtps2dq_avx512f(auVar72);
                      auVar71 = vmovdqa64_avx512f(auVar73);
                      _local_a800 = auVar71;
                      auVar72 = vpbroadcastd_avx512f();
                      uVar25 = vpcmpd_avx512f(auVar72,auVar73,4);
                      if (((ushort)uVar25 & local_a85c) == 0) {
                        lVar2 = *(long *)(*(long *)&local_a7b0[2].numPrimitives +
                                         (long)*(int *)(local_a800 + local_a820 * 4) * 0x38);
                        lVar3 = *(long *)(*(long *)&local_a7b0[2].numPrimitives + 0x38 +
                                         (long)*(int *)(local_a800 + local_a820 * 4) * 0x38);
                        uVar51 = (ulong)*(uint *)(lVar54 + lVar56 * 4);
                        uVar60 = (ulong)*(uint *)(lVar54 + 0x10 + lVar56 * 4);
                        auVar75 = vsubps_avx512f(auVar69,auVar74);
                        uVar1 = *(undefined4 *)(lVar3 + uVar51 * 4);
                        auVar72._4_4_ = uVar1;
                        auVar72._0_4_ = uVar1;
                        auVar72._8_4_ = uVar1;
                        auVar72._12_4_ = uVar1;
                        auVar72._16_4_ = uVar1;
                        auVar72._20_4_ = uVar1;
                        auVar72._24_4_ = uVar1;
                        auVar72._28_4_ = uVar1;
                        auVar72._32_4_ = uVar1;
                        auVar72._36_4_ = uVar1;
                        auVar72._40_4_ = uVar1;
                        auVar72._44_4_ = uVar1;
                        auVar72._48_4_ = uVar1;
                        auVar72._52_4_ = uVar1;
                        auVar72._56_4_ = uVar1;
                        auVar72._60_4_ = uVar1;
                        auVar72 = vmulps_avx512f(auVar74,auVar72);
                        uVar1 = *(undefined4 *)(lVar3 + 4 + uVar51 * 4);
                        auVar84._4_4_ = uVar1;
                        auVar84._0_4_ = uVar1;
                        auVar84._8_4_ = uVar1;
                        auVar84._12_4_ = uVar1;
                        auVar84._16_4_ = uVar1;
                        auVar84._20_4_ = uVar1;
                        auVar84._24_4_ = uVar1;
                        auVar84._28_4_ = uVar1;
                        auVar84._32_4_ = uVar1;
                        auVar84._36_4_ = uVar1;
                        auVar84._40_4_ = uVar1;
                        auVar84._44_4_ = uVar1;
                        auVar84._48_4_ = uVar1;
                        auVar84._52_4_ = uVar1;
                        auVar84._56_4_ = uVar1;
                        auVar84._60_4_ = uVar1;
                        auVar76 = vmulps_avx512f(auVar74,auVar84);
                        uVar1 = *(undefined4 *)(lVar3 + 8 + uVar51 * 4);
                        auVar85._4_4_ = uVar1;
                        auVar85._0_4_ = uVar1;
                        auVar85._8_4_ = uVar1;
                        auVar85._12_4_ = uVar1;
                        auVar85._16_4_ = uVar1;
                        auVar85._20_4_ = uVar1;
                        auVar85._24_4_ = uVar1;
                        auVar85._28_4_ = uVar1;
                        auVar85._32_4_ = uVar1;
                        auVar85._36_4_ = uVar1;
                        auVar85._40_4_ = uVar1;
                        auVar85._44_4_ = uVar1;
                        auVar85._48_4_ = uVar1;
                        auVar85._52_4_ = uVar1;
                        auVar85._56_4_ = uVar1;
                        auVar85._60_4_ = uVar1;
                        auVar77 = vmulps_avx512f(auVar74,auVar85);
                        uVar1 = *(undefined4 *)(lVar2 + uVar51 * 4);
                        auVar86._4_4_ = uVar1;
                        auVar86._0_4_ = uVar1;
                        auVar86._8_4_ = uVar1;
                        auVar86._12_4_ = uVar1;
                        auVar86._16_4_ = uVar1;
                        auVar86._20_4_ = uVar1;
                        auVar86._24_4_ = uVar1;
                        auVar86._28_4_ = uVar1;
                        auVar86._32_4_ = uVar1;
                        auVar86._36_4_ = uVar1;
                        auVar86._40_4_ = uVar1;
                        auVar86._44_4_ = uVar1;
                        auVar86._48_4_ = uVar1;
                        auVar86._52_4_ = uVar1;
                        auVar86._56_4_ = uVar1;
                        auVar86._60_4_ = uVar1;
                        auVar73 = vfmadd231ps_avx512f(auVar72,auVar75,auVar86);
                        uVar1 = *(undefined4 *)(lVar2 + 4 + uVar51 * 4);
                        auVar87._4_4_ = uVar1;
                        auVar87._0_4_ = uVar1;
                        auVar87._8_4_ = uVar1;
                        auVar87._12_4_ = uVar1;
                        auVar87._16_4_ = uVar1;
                        auVar87._20_4_ = uVar1;
                        auVar87._24_4_ = uVar1;
                        auVar87._28_4_ = uVar1;
                        auVar87._32_4_ = uVar1;
                        auVar87._36_4_ = uVar1;
                        auVar87._40_4_ = uVar1;
                        auVar87._44_4_ = uVar1;
                        auVar87._48_4_ = uVar1;
                        auVar87._52_4_ = uVar1;
                        auVar87._56_4_ = uVar1;
                        auVar87._60_4_ = uVar1;
                        auVar76 = vfmadd231ps_avx512f(auVar76,auVar75,auVar87);
                        uVar1 = *(undefined4 *)(lVar2 + 8 + uVar51 * 4);
                        auVar88._4_4_ = uVar1;
                        auVar88._0_4_ = uVar1;
                        auVar88._8_4_ = uVar1;
                        auVar88._12_4_ = uVar1;
                        auVar88._16_4_ = uVar1;
                        auVar88._20_4_ = uVar1;
                        auVar88._24_4_ = uVar1;
                        auVar88._28_4_ = uVar1;
                        auVar88._32_4_ = uVar1;
                        auVar88._36_4_ = uVar1;
                        auVar88._40_4_ = uVar1;
                        auVar88._44_4_ = uVar1;
                        auVar88._48_4_ = uVar1;
                        auVar88._52_4_ = uVar1;
                        auVar88._56_4_ = uVar1;
                        auVar88._60_4_ = uVar1;
                        auVar77 = vfmadd231ps_avx512f(auVar77,auVar75,auVar88);
                        uVar1 = *(undefined4 *)(lVar3 + uVar60 * 4);
                        auVar89._4_4_ = uVar1;
                        auVar89._0_4_ = uVar1;
                        auVar89._8_4_ = uVar1;
                        auVar89._12_4_ = uVar1;
                        auVar89._16_4_ = uVar1;
                        auVar89._20_4_ = uVar1;
                        auVar89._24_4_ = uVar1;
                        auVar89._28_4_ = uVar1;
                        auVar89._32_4_ = uVar1;
                        auVar89._36_4_ = uVar1;
                        auVar89._40_4_ = uVar1;
                        auVar89._44_4_ = uVar1;
                        auVar89._48_4_ = uVar1;
                        auVar89._52_4_ = uVar1;
                        auVar89._56_4_ = uVar1;
                        auVar89._60_4_ = uVar1;
                        auVar72 = vmulps_avx512f(auVar74,auVar89);
                        uVar1 = *(undefined4 *)(lVar3 + 4 + uVar60 * 4);
                        auVar90._4_4_ = uVar1;
                        auVar90._0_4_ = uVar1;
                        auVar90._8_4_ = uVar1;
                        auVar90._12_4_ = uVar1;
                        auVar90._16_4_ = uVar1;
                        auVar90._20_4_ = uVar1;
                        auVar90._24_4_ = uVar1;
                        auVar90._28_4_ = uVar1;
                        auVar90._32_4_ = uVar1;
                        auVar90._36_4_ = uVar1;
                        auVar90._40_4_ = uVar1;
                        auVar90._44_4_ = uVar1;
                        auVar90._48_4_ = uVar1;
                        auVar90._52_4_ = uVar1;
                        auVar90._56_4_ = uVar1;
                        auVar90._60_4_ = uVar1;
                        auVar78 = vmulps_avx512f(auVar74,auVar90);
                        uVar1 = *(undefined4 *)(lVar3 + 8 + uVar60 * 4);
                        auVar91._4_4_ = uVar1;
                        auVar91._0_4_ = uVar1;
                        auVar91._8_4_ = uVar1;
                        auVar91._12_4_ = uVar1;
                        auVar91._16_4_ = uVar1;
                        auVar91._20_4_ = uVar1;
                        auVar91._24_4_ = uVar1;
                        auVar91._28_4_ = uVar1;
                        auVar91._32_4_ = uVar1;
                        auVar91._36_4_ = uVar1;
                        auVar91._40_4_ = uVar1;
                        auVar91._44_4_ = uVar1;
                        auVar91._48_4_ = uVar1;
                        auVar91._52_4_ = uVar1;
                        auVar91._56_4_ = uVar1;
                        auVar91._60_4_ = uVar1;
                        auVar79 = vmulps_avx512f(auVar74,auVar91);
                        uVar1 = *(undefined4 *)(lVar2 + uVar60 * 4);
                        auVar92._4_4_ = uVar1;
                        auVar92._0_4_ = uVar1;
                        auVar92._8_4_ = uVar1;
                        auVar92._12_4_ = uVar1;
                        auVar92._16_4_ = uVar1;
                        auVar92._20_4_ = uVar1;
                        auVar92._24_4_ = uVar1;
                        auVar92._28_4_ = uVar1;
                        auVar92._32_4_ = uVar1;
                        auVar92._36_4_ = uVar1;
                        auVar92._40_4_ = uVar1;
                        auVar92._44_4_ = uVar1;
                        auVar92._48_4_ = uVar1;
                        auVar92._52_4_ = uVar1;
                        auVar92._56_4_ = uVar1;
                        auVar92._60_4_ = uVar1;
                        local_9ec0 = vfmadd231ps_avx512f(auVar72,auVar75,auVar92);
                        uVar1 = *(undefined4 *)(lVar2 + 4 + uVar60 * 4);
                        auVar28._4_4_ = uVar1;
                        auVar28._0_4_ = uVar1;
                        auVar28._8_4_ = uVar1;
                        auVar28._12_4_ = uVar1;
                        auVar28._16_4_ = uVar1;
                        auVar28._20_4_ = uVar1;
                        auVar28._24_4_ = uVar1;
                        auVar28._28_4_ = uVar1;
                        auVar28._32_4_ = uVar1;
                        auVar28._36_4_ = uVar1;
                        auVar28._40_4_ = uVar1;
                        auVar28._44_4_ = uVar1;
                        auVar28._48_4_ = uVar1;
                        auVar28._52_4_ = uVar1;
                        auVar28._56_4_ = uVar1;
                        auVar28._60_4_ = uVar1;
                        local_9f00 = vfmadd231ps_avx512f(auVar78,auVar75,auVar28);
                        uVar1 = *(undefined4 *)(lVar2 + 8 + uVar60 * 4);
                        auVar29._4_4_ = uVar1;
                        auVar29._0_4_ = uVar1;
                        auVar29._8_4_ = uVar1;
                        auVar29._12_4_ = uVar1;
                        auVar29._16_4_ = uVar1;
                        auVar29._20_4_ = uVar1;
                        auVar29._24_4_ = uVar1;
                        auVar29._28_4_ = uVar1;
                        auVar29._32_4_ = uVar1;
                        auVar29._36_4_ = uVar1;
                        auVar29._40_4_ = uVar1;
                        auVar29._44_4_ = uVar1;
                        auVar29._48_4_ = uVar1;
                        auVar29._52_4_ = uVar1;
                        auVar29._56_4_ = uVar1;
                        auVar29._60_4_ = uVar1;
                        local_9f40 = vfmadd231ps_avx512f(auVar79,auVar75,auVar29);
                        uVar51 = (ulong)*(uint *)(lVar54 + 0x20 + lVar56 * 4);
                        uVar1 = *(undefined4 *)(lVar3 + uVar51 * 4);
                        auVar30._4_4_ = uVar1;
                        auVar30._0_4_ = uVar1;
                        auVar30._8_4_ = uVar1;
                        auVar30._12_4_ = uVar1;
                        auVar30._16_4_ = uVar1;
                        auVar30._20_4_ = uVar1;
                        auVar30._24_4_ = uVar1;
                        auVar30._28_4_ = uVar1;
                        auVar30._32_4_ = uVar1;
                        auVar30._36_4_ = uVar1;
                        auVar30._40_4_ = uVar1;
                        auVar30._44_4_ = uVar1;
                        auVar30._48_4_ = uVar1;
                        auVar30._52_4_ = uVar1;
                        auVar30._56_4_ = uVar1;
                        auVar30._60_4_ = uVar1;
                        auVar72 = vmulps_avx512f(auVar74,auVar30);
                        uVar1 = *(undefined4 *)(lVar3 + 4 + uVar51 * 4);
                        auVar31._4_4_ = uVar1;
                        auVar31._0_4_ = uVar1;
                        auVar31._8_4_ = uVar1;
                        auVar31._12_4_ = uVar1;
                        auVar31._16_4_ = uVar1;
                        auVar31._20_4_ = uVar1;
                        auVar31._24_4_ = uVar1;
                        auVar31._28_4_ = uVar1;
                        auVar31._32_4_ = uVar1;
                        auVar31._36_4_ = uVar1;
                        auVar31._40_4_ = uVar1;
                        auVar31._44_4_ = uVar1;
                        auVar31._48_4_ = uVar1;
                        auVar31._52_4_ = uVar1;
                        auVar31._56_4_ = uVar1;
                        auVar31._60_4_ = uVar1;
                        auVar78 = vmulps_avx512f(auVar74,auVar31);
                        uVar1 = *(undefined4 *)(lVar3 + 8 + uVar51 * 4);
                        auVar32._4_4_ = uVar1;
                        auVar32._0_4_ = uVar1;
                        auVar32._8_4_ = uVar1;
                        auVar32._12_4_ = uVar1;
                        auVar32._16_4_ = uVar1;
                        auVar32._20_4_ = uVar1;
                        auVar32._24_4_ = uVar1;
                        auVar32._28_4_ = uVar1;
                        auVar32._32_4_ = uVar1;
                        auVar32._36_4_ = uVar1;
                        auVar32._40_4_ = uVar1;
                        auVar32._44_4_ = uVar1;
                        auVar32._48_4_ = uVar1;
                        auVar32._52_4_ = uVar1;
                        auVar32._56_4_ = uVar1;
                        auVar32._60_4_ = uVar1;
                        auVar79 = vmulps_avx512f(auVar74,auVar32);
                        uVar1 = *(undefined4 *)(lVar2 + uVar51 * 4);
                        auVar33._4_4_ = uVar1;
                        auVar33._0_4_ = uVar1;
                        auVar33._8_4_ = uVar1;
                        auVar33._12_4_ = uVar1;
                        auVar33._16_4_ = uVar1;
                        auVar33._20_4_ = uVar1;
                        auVar33._24_4_ = uVar1;
                        auVar33._28_4_ = uVar1;
                        auVar33._32_4_ = uVar1;
                        auVar33._36_4_ = uVar1;
                        auVar33._40_4_ = uVar1;
                        auVar33._44_4_ = uVar1;
                        auVar33._48_4_ = uVar1;
                        auVar33._52_4_ = uVar1;
                        auVar33._56_4_ = uVar1;
                        auVar33._60_4_ = uVar1;
                        local_a300 = vfmadd231ps_avx512f(auVar72,auVar75,auVar33);
                        uVar1 = *(undefined4 *)(lVar2 + 4 + uVar51 * 4);
                        auVar34._4_4_ = uVar1;
                        auVar34._0_4_ = uVar1;
                        auVar34._8_4_ = uVar1;
                        auVar34._12_4_ = uVar1;
                        auVar34._16_4_ = uVar1;
                        auVar34._20_4_ = uVar1;
                        auVar34._24_4_ = uVar1;
                        auVar34._28_4_ = uVar1;
                        auVar34._32_4_ = uVar1;
                        auVar34._36_4_ = uVar1;
                        auVar34._40_4_ = uVar1;
                        auVar34._44_4_ = uVar1;
                        auVar34._48_4_ = uVar1;
                        auVar34._52_4_ = uVar1;
                        auVar34._56_4_ = uVar1;
                        auVar34._60_4_ = uVar1;
                        local_a340 = vfmadd231ps_avx512f(auVar78,auVar75,auVar34);
                        uVar1 = *(undefined4 *)(lVar2 + 8 + uVar51 * 4);
                        auVar35._4_4_ = uVar1;
                        auVar35._0_4_ = uVar1;
                        auVar35._8_4_ = uVar1;
                        auVar35._12_4_ = uVar1;
                        auVar35._16_4_ = uVar1;
                        auVar35._20_4_ = uVar1;
                        auVar35._24_4_ = uVar1;
                        auVar35._28_4_ = uVar1;
                        auVar35._32_4_ = uVar1;
                        auVar35._36_4_ = uVar1;
                        auVar35._40_4_ = uVar1;
                        auVar35._44_4_ = uVar1;
                        auVar35._48_4_ = uVar1;
                        auVar35._52_4_ = uVar1;
                        auVar35._56_4_ = uVar1;
                        auVar35._60_4_ = uVar1;
                        local_a380 = vfmadd231ps_avx512f(auVar79,auVar75,auVar35);
                        uVar51 = (ulong)*(uint *)(lVar54 + 0x30 + lVar56 * 4);
                        uVar1 = *(undefined4 *)(lVar3 + uVar51 * 4);
                        auVar36._4_4_ = uVar1;
                        auVar36._0_4_ = uVar1;
                        auVar36._8_4_ = uVar1;
                        auVar36._12_4_ = uVar1;
                        auVar36._16_4_ = uVar1;
                        auVar36._20_4_ = uVar1;
                        auVar36._24_4_ = uVar1;
                        auVar36._28_4_ = uVar1;
                        auVar36._32_4_ = uVar1;
                        auVar36._36_4_ = uVar1;
                        auVar36._40_4_ = uVar1;
                        auVar36._44_4_ = uVar1;
                        auVar36._48_4_ = uVar1;
                        auVar36._52_4_ = uVar1;
                        auVar36._56_4_ = uVar1;
                        auVar36._60_4_ = uVar1;
                        auVar72 = vmulps_avx512f(auVar74,auVar36);
                        uVar1 = *(undefined4 *)(lVar3 + 4 + uVar51 * 4);
                        auVar37._4_4_ = uVar1;
                        auVar37._0_4_ = uVar1;
                        auVar37._8_4_ = uVar1;
                        auVar37._12_4_ = uVar1;
                        auVar37._16_4_ = uVar1;
                        auVar37._20_4_ = uVar1;
                        auVar37._24_4_ = uVar1;
                        auVar37._28_4_ = uVar1;
                        auVar37._32_4_ = uVar1;
                        auVar37._36_4_ = uVar1;
                        auVar37._40_4_ = uVar1;
                        auVar37._44_4_ = uVar1;
                        auVar37._48_4_ = uVar1;
                        auVar37._52_4_ = uVar1;
                        auVar37._56_4_ = uVar1;
                        auVar37._60_4_ = uVar1;
                        auVar78 = vmulps_avx512f(auVar74,auVar37);
                        uVar1 = *(undefined4 *)(lVar3 + 8 + uVar51 * 4);
                        auVar38._4_4_ = uVar1;
                        auVar38._0_4_ = uVar1;
                        auVar38._8_4_ = uVar1;
                        auVar38._12_4_ = uVar1;
                        auVar38._16_4_ = uVar1;
                        auVar38._20_4_ = uVar1;
                        auVar38._24_4_ = uVar1;
                        auVar38._28_4_ = uVar1;
                        auVar38._32_4_ = uVar1;
                        auVar38._36_4_ = uVar1;
                        auVar38._40_4_ = uVar1;
                        auVar38._44_4_ = uVar1;
                        auVar38._48_4_ = uVar1;
                        auVar38._52_4_ = uVar1;
                        auVar38._56_4_ = uVar1;
                        auVar38._60_4_ = uVar1;
                        auVar74 = vmulps_avx512f(auVar74,auVar38);
                        uVar1 = *(undefined4 *)(lVar2 + uVar51 * 4);
                        auVar39._4_4_ = uVar1;
                        auVar39._0_4_ = uVar1;
                        auVar39._8_4_ = uVar1;
                        auVar39._12_4_ = uVar1;
                        auVar39._16_4_ = uVar1;
                        auVar39._20_4_ = uVar1;
                        auVar39._24_4_ = uVar1;
                        auVar39._28_4_ = uVar1;
                        auVar39._32_4_ = uVar1;
                        auVar39._36_4_ = uVar1;
                        auVar39._40_4_ = uVar1;
                        auVar39._44_4_ = uVar1;
                        auVar39._48_4_ = uVar1;
                        auVar39._52_4_ = uVar1;
                        auVar39._56_4_ = uVar1;
                        auVar39._60_4_ = uVar1;
                        auVar72 = vfmadd231ps_avx512f(auVar72,auVar75,auVar39);
                        uVar1 = *(undefined4 *)(lVar2 + 4 + uVar51 * 4);
                        auVar40._4_4_ = uVar1;
                        auVar40._0_4_ = uVar1;
                        auVar40._8_4_ = uVar1;
                        auVar40._12_4_ = uVar1;
                        auVar40._16_4_ = uVar1;
                        auVar40._20_4_ = uVar1;
                        auVar40._24_4_ = uVar1;
                        auVar40._28_4_ = uVar1;
                        auVar40._32_4_ = uVar1;
                        auVar40._36_4_ = uVar1;
                        auVar40._40_4_ = uVar1;
                        auVar40._44_4_ = uVar1;
                        auVar40._48_4_ = uVar1;
                        auVar40._52_4_ = uVar1;
                        auVar40._56_4_ = uVar1;
                        auVar40._60_4_ = uVar1;
                        local_a780 = vfmadd231ps_avx512f(auVar78,auVar75,auVar40);
                        uVar1 = *(undefined4 *)(lVar2 + 8 + uVar51 * 4);
                        auVar41._4_4_ = uVar1;
                        auVar41._0_4_ = uVar1;
                        auVar41._8_4_ = uVar1;
                        auVar41._12_4_ = uVar1;
                        auVar41._16_4_ = uVar1;
                        auVar41._20_4_ = uVar1;
                        auVar41._24_4_ = uVar1;
                        auVar41._28_4_ = uVar1;
                        auVar41._32_4_ = uVar1;
                        auVar41._36_4_ = uVar1;
                        auVar41._40_4_ = uVar1;
                        auVar41._44_4_ = uVar1;
                        auVar41._48_4_ = uVar1;
                        auVar41._52_4_ = uVar1;
                        auVar41._56_4_ = uVar1;
                        auVar41._60_4_ = uVar1;
                        local_a680 = vfmadd231ps_avx512f(auVar74,auVar75,auVar41);
                      }
                      else {
                        auVar73 = ZEXT1664(auVar64);
                        if (local_a85c != 0) {
                          lVar2 = *(long *)&local_a7b0[2].numPrimitives;
                          uVar60 = (ulong)*(uint *)(lVar54 + lVar56 * 4);
                          uVar51 = local_a818;
                          uVar58 = local_a820;
                          do {
                            auVar64 = *(undefined1 (*) [16])
                                       (*(long *)(lVar2 + (long)*(int *)(local_a800 + uVar58 * 4) *
                                                          0x38) + uVar60 * 4);
                            auVar63 = *(undefined1 (*) [16])
                                       (*(long *)(lVar2 + 0x38 +
                                                 (long)*(int *)(local_a800 + uVar58 * 4) * 0x38) +
                                       uVar60 * 4);
                            *(int *)(local_a600 + uVar58 * 4) = auVar64._0_4_;
                            uVar1 = vextractps_avx(auVar64,1);
                            *(undefined4 *)(local_a5c0 + uVar58 * 4) = uVar1;
                            uVar1 = vextractps_avx(auVar64,2);
                            *(undefined4 *)(local_a580 + uVar58 * 4) = uVar1;
                            *(int *)(local_a740 + uVar58 * 4) = auVar63._0_4_;
                            uVar1 = vextractps_avx(auVar63,1);
                            *(undefined4 *)(local_a700 + uVar58 * 4) = uVar1;
                            uVar1 = vextractps_avx(auVar63,2);
                            *(undefined4 *)(local_a6c0 + uVar58 * 4) = uVar1;
                            uVar51 = uVar51 ^ 1L << (uVar58 & 0x3f);
                            uVar58 = 0;
                            for (uVar23 = uVar51; (uVar23 & 1) == 0;
                                uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                              uVar58 = uVar58 + 1;
                            }
                            auVar72 = local_a740;
                            auVar73 = local_a600;
                          } while (uVar51 != 0);
                        }
                        auVar75 = vsubps_avx512f(auVar69,auVar74);
                        auVar76 = vmulps_avx512f(auVar75,local_a5c0);
                        auVar77 = vmulps_avx512f(auVar75,local_a580);
                        auVar78 = vmulps_avx512f(auVar74,local_a700);
                        auVar79 = vmulps_avx512f(auVar74,local_a6c0);
                        if (local_a85c != 0) {
                          lVar2 = *(long *)&local_a7b0[2].numPrimitives;
                          uVar60 = (ulong)*(uint *)(lVar54 + 0x10 + lVar56 * 4);
                          uVar51 = local_a818;
                          uVar58 = local_a820;
                          do {
                            auVar64 = *(undefined1 (*) [16])
                                       (*(long *)(lVar2 + (long)*(int *)(local_a800 + uVar58 * 4) *
                                                          0x38) + uVar60 * 4);
                            auVar63 = *(undefined1 (*) [16])
                                       (*(long *)(lVar2 + 0x38 +
                                                 (long)*(int *)(local_a800 + uVar58 * 4) * 0x38) +
                                       uVar60 * 4);
                            *(int *)(local_a600 + uVar58 * 4) = auVar64._0_4_;
                            uVar1 = vextractps_avx(auVar64,1);
                            *(undefined4 *)(local_a5c0 + uVar58 * 4) = uVar1;
                            uVar1 = vextractps_avx(auVar64,2);
                            *(undefined4 *)(local_a580 + uVar58 * 4) = uVar1;
                            *(int *)(local_a740 + uVar58 * 4) = auVar63._0_4_;
                            uVar1 = vextractps_avx(auVar63,1);
                            *(undefined4 *)(local_a700 + uVar58 * 4) = uVar1;
                            uVar1 = vextractps_avx(auVar63,2);
                            *(undefined4 *)(local_a6c0 + uVar58 * 4) = uVar1;
                            uVar51 = uVar51 ^ 1L << (uVar58 & 0x3f);
                            uVar58 = 0;
                            for (uVar23 = uVar51; (uVar23 & 1) == 0;
                                uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                              uVar58 = uVar58 + 1;
                            }
                            in_ZMM8 = local_a740;
                            in_ZMM9 = local_a600;
                          } while (uVar51 != 0);
                        }
                        auVar96 = vmulps_avx512f(auVar75,local_a5c0);
                        auVar80 = vmulps_avx512f(auVar75,local_a580);
                        auVar81 = vmulps_avx512f(auVar74,local_a700);
                        auVar82 = vmulps_avx512f(auVar74,local_a6c0);
                        if (local_a85c != 0) {
                          lVar2 = *(long *)&local_a7b0[2].numPrimitives;
                          uVar60 = (ulong)*(uint *)(lVar54 + 0x20 + lVar56 * 4);
                          uVar51 = local_a818;
                          uVar58 = local_a820;
                          do {
                            auVar64 = *(undefined1 (*) [16])
                                       (*(long *)(lVar2 + (long)*(int *)(local_a800 + uVar58 * 4) *
                                                          0x38) + uVar60 * 4);
                            auVar63 = *(undefined1 (*) [16])
                                       (*(long *)(lVar2 + 0x38 +
                                                 (long)*(int *)(local_a800 + uVar58 * 4) * 0x38) +
                                       uVar60 * 4);
                            *(int *)(local_a600 + uVar58 * 4) = auVar64._0_4_;
                            uVar1 = vextractps_avx(auVar64,1);
                            *(undefined4 *)(local_a5c0 + uVar58 * 4) = uVar1;
                            uVar1 = vextractps_avx(auVar64,2);
                            *(undefined4 *)(local_a580 + uVar58 * 4) = uVar1;
                            *(int *)(local_a740 + uVar58 * 4) = auVar63._0_4_;
                            uVar1 = vextractps_avx(auVar63,1);
                            *(undefined4 *)(local_a700 + uVar58 * 4) = uVar1;
                            uVar1 = vextractps_avx(auVar63,2);
                            *(undefined4 *)(local_a6c0 + uVar58 * 4) = uVar1;
                            uVar51 = uVar51 ^ 1L << (uVar58 & 0x3f);
                            uVar58 = 0;
                            for (uVar23 = uVar51; (uVar23 & 1) == 0;
                                uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                              uVar58 = uVar58 + 1;
                            }
                            in_ZMM14 = local_a740;
                            in_ZMM15 = local_a600;
                          } while (uVar51 != 0);
                        }
                        auVar83 = vmulps_avx512f(auVar75,local_a5c0);
                        auVar84 = vmulps_avx512f(auVar75,local_a580);
                        auVar85 = vmulps_avx512f(auVar74,local_a700);
                        auVar86 = vmulps_avx512f(auVar74,local_a6c0);
                        if (local_a85c != 0) {
                          lVar2 = *(long *)&local_a7b0[2].numPrimitives;
                          uVar60 = (ulong)*(uint *)(lVar54 + 0x30 + lVar56 * 4);
                          uVar51 = local_a818;
                          uVar58 = local_a820;
                          do {
                            auVar64 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                          (*(long *)(lVar2 + (long)*(int *)(
                                                  local_a800 + uVar58 * 4) * 0x38) + uVar60 * 4));
                            auVar63 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                          (*(long *)(lVar2 + 0x38 +
                                                                    (long)*(int *)(local_a800 +
                                                                                  uVar58 * 4) * 0x38
                                                                    ) + uVar60 * 4));
                            *(int *)(local_a600 + uVar58 * 4) = auVar64._0_4_;
                            uVar1 = vextractps_avx512f(auVar64,1);
                            *(undefined4 *)(local_a5c0 + uVar58 * 4) = uVar1;
                            uVar1 = vextractps_avx512f(auVar64,2);
                            *(undefined4 *)(local_a580 + uVar58 * 4) = uVar1;
                            *(int *)(local_a740 + uVar58 * 4) = auVar63._0_4_;
                            uVar1 = vextractps_avx512f(auVar63,1);
                            *(undefined4 *)(local_a700 + uVar58 * 4) = uVar1;
                            uVar1 = vextractps_avx512f(auVar63,2);
                            *(undefined4 *)(local_a6c0 + uVar58 * 4) = uVar1;
                            uVar51 = uVar51 ^ 1L << (uVar58 & 0x3f);
                            uVar58 = 0;
                            for (uVar23 = uVar51; (uVar23 & 1) == 0;
                                uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                              uVar58 = uVar58 + 1;
                            }
                            in_ZMM20 = local_a740;
                            in_ZMM21 = local_a600;
                          } while (uVar51 != 0);
                        }
                        auVar73 = vmulps_avx512f(auVar75,auVar73);
                        auVar72 = vmulps_avx512f(auVar74,auVar72);
                        auVar73 = vaddps_avx512f(auVar73,auVar72);
                        auVar76 = vaddps_avx512f(auVar76,auVar78);
                        auVar77 = vaddps_avx512f(auVar77,auVar79);
                        auVar72 = vmulps_avx512f(auVar75,in_ZMM9);
                        auVar78 = vmulps_avx512f(auVar74,in_ZMM8);
                        local_9ec0 = vaddps_avx512f(auVar72,auVar78);
                        local_9f00 = vaddps_avx512f(auVar96,auVar81);
                        local_9f40 = vaddps_avx512f(auVar80,auVar82);
                        auVar72 = vmulps_avx512f(auVar75,in_ZMM15);
                        auVar78 = vmulps_avx512f(auVar74,in_ZMM14);
                        local_a300 = vaddps_avx512f(auVar72,auVar78);
                        local_a340 = vaddps_avx512f(auVar83,auVar85);
                        local_a380 = vaddps_avx512f(auVar84,auVar86);
                        auVar72 = vmulps_avx512f(auVar75,in_ZMM21);
                        auVar78 = vmulps_avx512f(auVar75,local_a5c0);
                        auVar75 = vmulps_avx512f(auVar75,local_a580);
                        auVar79 = vmulps_avx512f(auVar74,in_ZMM20);
                        auVar72 = vaddps_avx512f(auVar72,auVar79);
                        auVar79 = vmulps_avx512f(auVar74,local_a700);
                        local_a780 = vaddps_avx512f(auVar78,auVar79);
                        auVar74 = vmulps_avx512f(auVar74,local_a6c0);
                        local_a680 = vaddps_avx512f(auVar75,auVar74);
                        uVar58 = local_a830;
                        local_a838 = lVar56;
                      }
                      auVar74 = *(undefined1 (*) [64])ray;
                      auVar75 = *(undefined1 (*) [64])(ray + 0x40);
                      auVar78 = *(undefined1 (*) [64])(ray + 0x80);
                      auVar79 = *(undefined1 (*) [64])(ray + 0x100);
                      in_ZMM8 = *(undefined1 (*) [64])(ray + 0x140);
                      auVar96 = *(undefined1 (*) [64])(ray + 0x180);
                      auVar73 = vsubps_avx512f(auVar73,auVar74);
                      auVar76 = vsubps_avx512f(auVar76,auVar75);
                      in_ZMM9 = vsubps_avx512f(auVar77,auVar78);
                      auVar77 = vsubps_avx512f(local_9ec0,auVar74);
                      auVar80 = vsubps_avx512f(local_9f00,auVar75);
                      auVar81 = vsubps_avx512f(local_9f40,auVar78);
                      auVar74 = vsubps_avx512f(auVar72,auVar74);
                      auVar75 = vsubps_avx512f(local_a780,auVar75);
                      auVar78 = vsubps_avx512f(local_a680,auVar78);
                      auVar82 = vsubps_avx512f(auVar74,auVar73);
                      auVar83 = vsubps_avx512f(auVar75,auVar76);
                      auVar84 = vsubps_avx512f(auVar78,in_ZMM9);
                      auVar85 = vsubps_avx512f(auVar73,auVar77);
                      auVar86 = vsubps_avx512f(auVar76,auVar80);
                      auVar87 = vsubps_avx512f(in_ZMM9,auVar81);
                      auVar88 = vaddps_avx512f(auVar74,auVar73);
                      auVar89 = vaddps_avx512f(auVar75,auVar76);
                      auVar90 = vaddps_avx512f(auVar78,in_ZMM9);
                      auVar91 = vmulps_avx512f(auVar89,auVar84);
                      auVar91 = vfmsub231ps_avx512f(auVar91,auVar83,auVar90);
                      auVar90 = vmulps_avx512f(auVar90,auVar82);
                      auVar90 = vfmsub231ps_avx512f(auVar90,auVar84,auVar88);
                      auVar88 = vmulps_avx512f(auVar88,auVar83);
                      auVar88 = vfmsub231ps_avx512f(auVar88,auVar82,auVar89);
                      auVar88 = vmulps_avx512f(auVar88,auVar96);
                      auVar88 = vfmadd231ps_avx512f(auVar88,in_ZMM8,auVar90);
                      auVar88 = vfmadd231ps_avx512f(auVar88,auVar79,auVar91);
                      auVar89 = vaddps_avx512f(auVar73,auVar77);
                      auVar90 = vaddps_avx512f(auVar76,auVar80);
                      auVar91 = vaddps_avx512f(in_ZMM9,auVar81);
                      auVar92 = vmulps_avx512f(auVar90,auVar87);
                      auVar92 = vfmsub231ps_avx512f(auVar92,auVar86,auVar91);
                      auVar91 = vmulps_avx512f(auVar91,auVar85);
                      auVar91 = vfmsub231ps_avx512f(auVar91,auVar87,auVar89);
                      auVar89 = vmulps_avx512f(auVar89,auVar86);
                      auVar89 = vfmsub231ps_avx512f(auVar89,auVar85,auVar90);
                      auVar90 = vsubps_avx512f(auVar77,auVar74);
                      auVar89 = vmulps_avx512f(auVar89,auVar96);
                      auVar89 = vfmadd231ps_avx512f(auVar89,in_ZMM8,auVar91);
                      auVar91 = vsubps_avx512f(auVar80,auVar75);
                      auVar89 = vfmadd231ps_avx512f(auVar89,auVar79,auVar92);
                      auVar92 = vsubps_avx512f(auVar81,auVar78);
                      auVar74 = vaddps_avx512f(auVar77,auVar74);
                      auVar75 = vaddps_avx512f(auVar80,auVar75);
                      auVar77 = vaddps_avx512f(auVar81,auVar78);
                      auVar78 = vmulps_avx512f(auVar75,auVar92);
                      auVar78 = vfmsub231ps_avx512f(auVar78,auVar91,auVar77);
                      auVar77 = vmulps_avx512f(auVar77,auVar90);
                      auVar77 = vfmsub231ps_avx512f(auVar77,auVar92,auVar74);
                      auVar74 = vmulps_avx512f(auVar74,auVar91);
                      auVar74 = vfmsub231ps_avx512f(auVar74,auVar90,auVar75);
                      auVar74 = vmulps_avx512f(auVar74,auVar96);
                      auVar74 = vfmadd231ps_avx512f(auVar74,in_ZMM8,auVar77);
                      in_ZMM21 = vfmadd231ps_avx512f(auVar74,auVar79,auVar78);
                      auVar74 = vaddps_avx512f(auVar88,auVar89);
                      in_ZMM14 = vaddps_avx512f(in_ZMM21,auVar74);
                      in_ZMM15 = vandps_avx512dq(in_ZMM14,auVar67);
                      auVar42._8_4_ = 0x34000000;
                      auVar42._0_8_ = 0x3400000034000000;
                      auVar42._12_4_ = 0x34000000;
                      auVar42._16_4_ = 0x34000000;
                      auVar42._20_4_ = 0x34000000;
                      auVar42._24_4_ = 0x34000000;
                      auVar42._28_4_ = 0x34000000;
                      auVar42._32_4_ = 0x34000000;
                      auVar42._36_4_ = 0x34000000;
                      auVar42._40_4_ = 0x34000000;
                      auVar42._44_4_ = 0x34000000;
                      auVar42._48_4_ = 0x34000000;
                      auVar42._52_4_ = 0x34000000;
                      auVar42._56_4_ = 0x34000000;
                      auVar42._60_4_ = 0x34000000;
                      auVar74 = vmulps_avx512f(in_ZMM15,auVar42);
                      auVar75 = vminps_avx512f(auVar88,auVar89);
                      auVar75 = vminps_avx512f(auVar75,in_ZMM21);
                      auVar43._8_4_ = 0x80000000;
                      auVar43._0_8_ = 0x8000000080000000;
                      auVar43._12_4_ = 0x80000000;
                      auVar43._16_4_ = 0x80000000;
                      auVar43._20_4_ = 0x80000000;
                      auVar43._24_4_ = 0x80000000;
                      auVar43._28_4_ = 0x80000000;
                      auVar43._32_4_ = 0x80000000;
                      auVar43._36_4_ = 0x80000000;
                      auVar43._40_4_ = 0x80000000;
                      auVar43._44_4_ = 0x80000000;
                      auVar43._48_4_ = 0x80000000;
                      auVar43._52_4_ = 0x80000000;
                      auVar43._56_4_ = 0x80000000;
                      auVar43._60_4_ = 0x80000000;
                      auVar77 = vxorps_avx512dq(auVar74,auVar43);
                      uVar25 = vcmpps_avx512f(auVar75,auVar77,5);
                      auVar75 = vmaxps_avx512f(auVar88,auVar89);
                      in_ZMM20 = vmaxps_avx512f(auVar75,in_ZMM21);
                      uVar26 = vcmpps_avx512f(in_ZMM20,auVar74,2);
                      uVar53 = ((ushort)uVar25 | (ushort)uVar26) & uVar53;
                      if (uVar53 != 0) {
                        local_a640 = auVar72;
                        auVar74 = vmulps_avx512f(auVar86,auVar84);
                        in_ZMM20 = vmulps_avx512f(auVar82,auVar87);
                        in_ZMM21 = vmulps_avx512f(auVar85,auVar83);
                        auVar75 = vmulps_avx512f(auVar91,auVar87);
                        auVar77 = vmulps_avx512f(auVar85,auVar92);
                        auVar78 = vmulps_avx512f(auVar90,auVar86);
                        auVar80 = vfmsub213ps_avx512f(auVar83,auVar87,auVar74);
                        auVar81 = vfmsub213ps_avx512f(auVar84,auVar85,in_ZMM20);
                        auVar82 = vfmsub213ps_avx512f(auVar82,auVar86,in_ZMM21);
                        auVar83 = vfmsub213ps_avx512f(auVar92,auVar86,auVar75);
                        auVar84 = vfmsub213ps_avx512f(auVar90,auVar87,auVar77);
                        auVar85 = vfmsub213ps_avx512f(auVar91,auVar85,auVar78);
                        auVar74 = vandps_avx512dq(auVar74,auVar67);
                        auVar75 = vandps_avx512dq(auVar75,auVar67);
                        uVar51 = vcmpps_avx512f(auVar74,auVar75,1);
                        auVar74 = vandps_avx512dq(in_ZMM20,auVar67);
                        auVar75 = vandps_avx512dq(auVar77,auVar67);
                        uVar60 = vcmpps_avx512f(auVar74,auVar75,1);
                        auVar74 = vandps_avx512dq(in_ZMM21,auVar67);
                        auVar75 = vandps_avx512dq(auVar78,auVar67);
                        uVar23 = vcmpps_avx512f(auVar74,auVar75,1);
                        bVar48 = (bool)((byte)uVar51 & 1);
                        auVar93._0_4_ = (uint)bVar48 * auVar80._0_4_ | (uint)!bVar48 * auVar83._0_4_
                        ;
                        bVar48 = (bool)((byte)(uVar51 >> 1) & 1);
                        auVar93._4_4_ = (uint)bVar48 * auVar80._4_4_ | (uint)!bVar48 * auVar83._4_4_
                        ;
                        bVar48 = (bool)((byte)(uVar51 >> 2) & 1);
                        auVar93._8_4_ = (uint)bVar48 * auVar80._8_4_ | (uint)!bVar48 * auVar83._8_4_
                        ;
                        bVar48 = (bool)((byte)(uVar51 >> 3) & 1);
                        auVar93._12_4_ =
                             (uint)bVar48 * auVar80._12_4_ | (uint)!bVar48 * auVar83._12_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 4) & 1);
                        auVar93._16_4_ =
                             (uint)bVar48 * auVar80._16_4_ | (uint)!bVar48 * auVar83._16_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 5) & 1);
                        auVar93._20_4_ =
                             (uint)bVar48 * auVar80._20_4_ | (uint)!bVar48 * auVar83._20_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 6) & 1);
                        auVar93._24_4_ =
                             (uint)bVar48 * auVar80._24_4_ | (uint)!bVar48 * auVar83._24_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 7) & 1);
                        auVar93._28_4_ =
                             (uint)bVar48 * auVar80._28_4_ | (uint)!bVar48 * auVar83._28_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 8) & 1);
                        auVar93._32_4_ =
                             (uint)bVar48 * auVar80._32_4_ | (uint)!bVar48 * auVar83._32_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 9) & 1);
                        auVar93._36_4_ =
                             (uint)bVar48 * auVar80._36_4_ | (uint)!bVar48 * auVar83._36_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 10) & 1);
                        auVar93._40_4_ =
                             (uint)bVar48 * auVar80._40_4_ | (uint)!bVar48 * auVar83._40_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 0xb) & 1);
                        auVar93._44_4_ =
                             (uint)bVar48 * auVar80._44_4_ | (uint)!bVar48 * auVar83._44_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 0xc) & 1);
                        auVar93._48_4_ =
                             (uint)bVar48 * auVar80._48_4_ | (uint)!bVar48 * auVar83._48_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 0xd) & 1);
                        auVar93._52_4_ =
                             (uint)bVar48 * auVar80._52_4_ | (uint)!bVar48 * auVar83._52_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 0xe) & 1);
                        auVar93._56_4_ =
                             (uint)bVar48 * auVar80._56_4_ | (uint)!bVar48 * auVar83._56_4_;
                        bVar48 = SUB81(uVar51 >> 0xf,0);
                        auVar93._60_4_ =
                             (uint)bVar48 * auVar80._60_4_ | (uint)!bVar48 * auVar83._60_4_;
                        bVar48 = (bool)((byte)uVar60 & 1);
                        auVar94._0_4_ = (uint)bVar48 * auVar81._0_4_ | (uint)!bVar48 * auVar84._0_4_
                        ;
                        bVar48 = (bool)((byte)(uVar60 >> 1) & 1);
                        auVar94._4_4_ = (uint)bVar48 * auVar81._4_4_ | (uint)!bVar48 * auVar84._4_4_
                        ;
                        bVar48 = (bool)((byte)(uVar60 >> 2) & 1);
                        auVar94._8_4_ = (uint)bVar48 * auVar81._8_4_ | (uint)!bVar48 * auVar84._8_4_
                        ;
                        bVar48 = (bool)((byte)(uVar60 >> 3) & 1);
                        auVar94._12_4_ =
                             (uint)bVar48 * auVar81._12_4_ | (uint)!bVar48 * auVar84._12_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 4) & 1);
                        auVar94._16_4_ =
                             (uint)bVar48 * auVar81._16_4_ | (uint)!bVar48 * auVar84._16_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 5) & 1);
                        auVar94._20_4_ =
                             (uint)bVar48 * auVar81._20_4_ | (uint)!bVar48 * auVar84._20_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 6) & 1);
                        auVar94._24_4_ =
                             (uint)bVar48 * auVar81._24_4_ | (uint)!bVar48 * auVar84._24_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 7) & 1);
                        auVar94._28_4_ =
                             (uint)bVar48 * auVar81._28_4_ | (uint)!bVar48 * auVar84._28_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 8) & 1);
                        auVar94._32_4_ =
                             (uint)bVar48 * auVar81._32_4_ | (uint)!bVar48 * auVar84._32_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 9) & 1);
                        auVar94._36_4_ =
                             (uint)bVar48 * auVar81._36_4_ | (uint)!bVar48 * auVar84._36_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 10) & 1);
                        auVar94._40_4_ =
                             (uint)bVar48 * auVar81._40_4_ | (uint)!bVar48 * auVar84._40_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 0xb) & 1);
                        auVar94._44_4_ =
                             (uint)bVar48 * auVar81._44_4_ | (uint)!bVar48 * auVar84._44_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 0xc) & 1);
                        auVar94._48_4_ =
                             (uint)bVar48 * auVar81._48_4_ | (uint)!bVar48 * auVar84._48_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 0xd) & 1);
                        auVar94._52_4_ =
                             (uint)bVar48 * auVar81._52_4_ | (uint)!bVar48 * auVar84._52_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 0xe) & 1);
                        auVar94._56_4_ =
                             (uint)bVar48 * auVar81._56_4_ | (uint)!bVar48 * auVar84._56_4_;
                        bVar48 = SUB81(uVar60 >> 0xf,0);
                        auVar94._60_4_ =
                             (uint)bVar48 * auVar81._60_4_ | (uint)!bVar48 * auVar84._60_4_;
                        bVar48 = (bool)((byte)uVar23 & 1);
                        auVar95._0_4_ = (uint)bVar48 * auVar82._0_4_ | (uint)!bVar48 * auVar85._0_4_
                        ;
                        bVar48 = (bool)((byte)(uVar23 >> 1) & 1);
                        auVar95._4_4_ = (uint)bVar48 * auVar82._4_4_ | (uint)!bVar48 * auVar85._4_4_
                        ;
                        bVar48 = (bool)((byte)(uVar23 >> 2) & 1);
                        auVar95._8_4_ = (uint)bVar48 * auVar82._8_4_ | (uint)!bVar48 * auVar85._8_4_
                        ;
                        bVar48 = (bool)((byte)(uVar23 >> 3) & 1);
                        auVar95._12_4_ =
                             (uint)bVar48 * auVar82._12_4_ | (uint)!bVar48 * auVar85._12_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 4) & 1);
                        auVar95._16_4_ =
                             (uint)bVar48 * auVar82._16_4_ | (uint)!bVar48 * auVar85._16_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 5) & 1);
                        auVar95._20_4_ =
                             (uint)bVar48 * auVar82._20_4_ | (uint)!bVar48 * auVar85._20_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 6) & 1);
                        auVar95._24_4_ =
                             (uint)bVar48 * auVar82._24_4_ | (uint)!bVar48 * auVar85._24_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 7) & 1);
                        auVar95._28_4_ =
                             (uint)bVar48 * auVar82._28_4_ | (uint)!bVar48 * auVar85._28_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 8) & 1);
                        auVar95._32_4_ =
                             (uint)bVar48 * auVar82._32_4_ | (uint)!bVar48 * auVar85._32_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 9) & 1);
                        auVar95._36_4_ =
                             (uint)bVar48 * auVar82._36_4_ | (uint)!bVar48 * auVar85._36_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 10) & 1);
                        auVar95._40_4_ =
                             (uint)bVar48 * auVar82._40_4_ | (uint)!bVar48 * auVar85._40_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 0xb) & 1);
                        auVar95._44_4_ =
                             (uint)bVar48 * auVar82._44_4_ | (uint)!bVar48 * auVar85._44_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 0xc) & 1);
                        auVar95._48_4_ =
                             (uint)bVar48 * auVar82._48_4_ | (uint)!bVar48 * auVar85._48_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 0xd) & 1);
                        auVar95._52_4_ =
                             (uint)bVar48 * auVar82._52_4_ | (uint)!bVar48 * auVar85._52_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 0xe) & 1);
                        auVar95._56_4_ =
                             (uint)bVar48 * auVar82._56_4_ | (uint)!bVar48 * auVar85._56_4_;
                        bVar48 = SUB81(uVar23 >> 0xf,0);
                        auVar95._60_4_ =
                             (uint)bVar48 * auVar82._60_4_ | (uint)!bVar48 * auVar85._60_4_;
                        auVar74 = vmulps_avx512f(auVar96,auVar95);
                        auVar74 = vfmadd213ps_avx512f(in_ZMM8,auVar94,auVar74);
                        auVar74 = vfmadd213ps_avx512f(auVar79,auVar93,auVar74);
                        auVar74 = vaddps_avx512f(auVar74,auVar74);
                        auVar75 = vmulps_avx512f(in_ZMM9,auVar95);
                        auVar75 = vfmadd213ps_avx512f(auVar76,auVar94,auVar75);
                        auVar73 = vfmadd213ps_avx512f(auVar73,auVar93,auVar75);
                        auVar75 = vrcp14ps_avx512f(auVar74);
                        auVar73 = vaddps_avx512f(auVar73,auVar73);
                        auVar76 = vfnmadd213ps_avx512f(auVar75,auVar74,auVar69);
                        auVar75 = vfmadd132ps_avx512f(auVar76,auVar75,auVar75);
                        auVar73 = vmulps_avx512f(auVar73,auVar75);
                        in_ZMM8 = *(undefined1 (*) [64])(ray + 0x200);
                        uVar25 = vcmpps_avx512f(auVar73,in_ZMM8,2);
                        uVar26 = vcmpps_avx512f(auVar73,*(undefined1 (*) [64])(ray + 0xc0),0xd);
                        uVar27 = vcmpps_avx512f(auVar74,auVar70,4);
                        uVar53 = uVar53 & (ushort)uVar25 & (ushort)uVar26 & (ushort)uVar27;
                        if (uVar53 != 0) {
                          auVar72 = vpbroadcastd_avx512f(ZEXT416(local_a7b0->mask));
                          uVar25 = vptestmd_avx512f(auVar72,*(undefined1 (*) [64])(ray + 0x240));
                          uVar53 = uVar53 & (ushort)uVar25;
                          auVar72 = local_a640;
                          if (uVar53 != 0) {
                            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                               (local_a7b0->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar47._8_4_ = 0x219392ef;
                              auVar47._0_8_ = 0x219392ef219392ef;
                              auVar47._12_4_ = 0x219392ef;
                              auVar47._16_4_ = 0x219392ef;
                              auVar47._20_4_ = 0x219392ef;
                              auVar47._24_4_ = 0x219392ef;
                              auVar47._28_4_ = 0x219392ef;
                              auVar47._32_4_ = 0x219392ef;
                              auVar47._36_4_ = 0x219392ef;
                              auVar47._40_4_ = 0x219392ef;
                              auVar47._44_4_ = 0x219392ef;
                              auVar47._48_4_ = 0x219392ef;
                              auVar47._52_4_ = 0x219392ef;
                              auVar47._56_4_ = 0x219392ef;
                              auVar47._60_4_ = 0x219392ef;
                              uVar51 = vcmpps_avx512f(in_ZMM15,auVar47,5);
                              auVar72 = vrcp14ps_avx512f(in_ZMM14);
                              auVar74 = vfnmadd213ps_avx512f(in_ZMM14,auVar72,auVar69);
                              auVar72 = vfmadd132ps_avx512f(auVar74,auVar72,auVar72);
                              auVar64._4_4_ = (uint)((byte)(uVar51 >> 1) & 1) * auVar72._4_4_;
                              auVar64._0_4_ = (uint)((byte)uVar51 & 1) * auVar72._0_4_;
                              auVar64._8_4_ = (uint)((byte)(uVar51 >> 2) & 1) * auVar72._8_4_;
                              auVar64._12_4_ = (uint)((byte)(uVar51 >> 3) & 1) * auVar72._12_4_;
                              in_ZMM14._16_4_ = (uint)((byte)(uVar51 >> 4) & 1) * auVar72._16_4_;
                              in_ZMM14._0_16_ = auVar64;
                              in_ZMM14._20_4_ = (uint)((byte)(uVar51 >> 5) & 1) * auVar72._20_4_;
                              in_ZMM14._24_4_ = (uint)((byte)(uVar51 >> 6) & 1) * auVar72._24_4_;
                              in_ZMM14._28_4_ = (uint)((byte)(uVar51 >> 7) & 1) * auVar72._28_4_;
                              in_ZMM14._32_4_ = (uint)((byte)(uVar51 >> 8) & 1) * auVar72._32_4_;
                              in_ZMM14._36_4_ = (uint)((byte)(uVar51 >> 9) & 1) * auVar72._36_4_;
                              in_ZMM14._40_4_ = (uint)((byte)(uVar51 >> 10) & 1) * auVar72._40_4_;
                              in_ZMM14._44_4_ = (uint)((byte)(uVar51 >> 0xb) & 1) * auVar72._44_4_;
                              in_ZMM14._48_4_ = (uint)((byte)(uVar51 >> 0xc) & 1) * auVar72._48_4_;
                              in_ZMM14._52_4_ = (uint)((byte)(uVar51 >> 0xd) & 1) * auVar72._52_4_;
                              in_ZMM14._56_4_ = (uint)((byte)(uVar51 >> 0xe) & 1) * auVar72._56_4_;
                              in_ZMM14._60_4_ = (uint)(byte)(uVar51 >> 0xf) * auVar72._60_4_;
                              auVar72 = vmulps_avx512f(auVar88,in_ZMM14);
                              local_a540 = vminps_avx512f(auVar72,auVar69);
                              auVar72 = vmulps_avx512f(auVar89,in_ZMM14);
                              local_a500 = vminps_avx512f(auVar72,auVar69);
                              local_a798 = context->user;
                              auVar72 = vpbroadcastd_avx512f();
                              auVar74 = vpbroadcastd_avx512f();
                              local_a600 = auVar93;
                              local_a5c0 = auVar94;
                              local_a580 = auVar95;
                              local_a4c0 = vmovdqa64_avx512f(auVar74);
                              local_a480 = vmovdqa64_avx512f(auVar72);
                              auVar65 = vpcmpeqd_avx2(local_a540._0_32_,local_a540._0_32_);
                              local_a7b8[3] = auVar65;
                              local_a7b8[2] = auVar65;
                              local_a7b8[1] = auVar65;
                              *local_a7b8 = auVar65;
                              local_a440 = vbroadcastss_avx512f(ZEXT416(local_a798->instID[0]));
                              local_a400 = vbroadcastss_avx512f(ZEXT416(local_a798->instPrimID[0]));
                              auVar72 = vblendmps_avx512f(in_ZMM8,auVar73);
                              bVar48 = (bool)((byte)uVar53 & 1);
                              bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
                              bVar8 = (bool)((byte)(uVar53 >> 2) & 1);
                              bVar9 = (bool)((byte)(uVar53 >> 3) & 1);
                              bVar10 = (bool)((byte)(uVar53 >> 4) & 1);
                              bVar11 = (bool)((byte)(uVar53 >> 5) & 1);
                              bVar12 = (bool)((byte)(uVar53 >> 6) & 1);
                              bVar13 = (bool)((byte)(uVar53 >> 7) & 1);
                              bVar14 = (byte)(uVar53 >> 8);
                              bVar15 = (bool)(bVar14 >> 1 & 1);
                              bVar16 = (bool)(bVar14 >> 2 & 1);
                              bVar17 = (bool)(bVar14 >> 3 & 1);
                              bVar18 = (bool)(bVar14 >> 4 & 1);
                              bVar19 = (bool)(bVar14 >> 5 & 1);
                              bVar20 = (bool)(bVar14 >> 6 & 1);
                              *(uint *)(ray + 0x200) =
                                   (uint)bVar48 * auVar72._0_4_ | (uint)!bVar48 * local_a400._0_4_;
                              *(uint *)(ray + 0x204) =
                                   (uint)bVar7 * auVar72._4_4_ | (uint)!bVar7 * local_a400._4_4_;
                              *(uint *)(ray + 0x208) =
                                   (uint)bVar8 * auVar72._8_4_ | (uint)!bVar8 * local_a400._8_4_;
                              *(uint *)(ray + 0x20c) =
                                   (uint)bVar9 * auVar72._12_4_ | (uint)!bVar9 * local_a400._12_4_;
                              *(uint *)(ray + 0x210) =
                                   (uint)bVar10 * auVar72._16_4_ | (uint)!bVar10 * local_a400._16_4_
                              ;
                              *(uint *)(ray + 0x214) =
                                   (uint)bVar11 * auVar72._20_4_ | (uint)!bVar11 * local_a400._20_4_
                              ;
                              *(uint *)(ray + 0x218) =
                                   (uint)bVar12 * auVar72._24_4_ | (uint)!bVar12 * local_a400._24_4_
                              ;
                              *(uint *)(ray + 0x21c) =
                                   (uint)bVar13 * auVar72._28_4_ | (uint)!bVar13 * local_a400._28_4_
                              ;
                              *(uint *)(ray + 0x220) =
                                   (uint)(bVar14 & 1) * auVar72._32_4_ |
                                   (uint)!(bool)(bVar14 & 1) * local_a400._32_4_;
                              *(uint *)(ray + 0x224) =
                                   (uint)bVar15 * auVar72._36_4_ | (uint)!bVar15 * local_a400._36_4_
                              ;
                              *(uint *)(ray + 0x228) =
                                   (uint)bVar16 * auVar72._40_4_ | (uint)!bVar16 * local_a400._40_4_
                              ;
                              *(uint *)(ray + 0x22c) =
                                   (uint)bVar17 * auVar72._44_4_ | (uint)!bVar17 * local_a400._44_4_
                              ;
                              *(uint *)(ray + 0x230) =
                                   (uint)bVar18 * auVar72._48_4_ | (uint)!bVar18 * local_a400._48_4_
                              ;
                              *(uint *)(ray + 0x234) =
                                   (uint)bVar19 * auVar72._52_4_ | (uint)!bVar19 * local_a400._52_4_
                              ;
                              *(uint *)(ray + 0x238) =
                                   (uint)bVar20 * auVar72._56_4_ | (uint)!bVar20 * local_a400._56_4_
                              ;
                              *(uint *)(ray + 0x23c) =
                                   (uint)(uVar53 >> 0xf) * auVar72._60_4_ |
                                   (uint)!(bool)(bVar14 >> 7) * local_a400._60_4_;
                              auVar72 = vpmovm2d_avx512dq((ulong)uVar53);
                              local_a740 = vmovdqa64_avx512f(auVar72);
                              local_a800._8_8_ = local_a7b0->userPtr;
                              local_a800._0_8_ = local_a740;
                              pRStack_a7f0 = context->user;
                              pRStack_a7e8 = ray;
                              puStack_a7e0 = local_a600;
                              auStack_a7d4 = auVar71._44_20_;
                              uStack_a7d8 = 0x10;
                              local_a3c0 = in_ZMM8;
                              local_a828 = lVar54;
                              if (local_a7b0->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                                in_ZMM14 = ZEXT1664(auVar64);
                                in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                                (*local_a7b0->occlusionFilterN)
                                          ((RTCFilterFunctionNArguments *)local_a800);
                                auVar62 = vxorps_avx512vl(auVar62,auVar62);
                                auVar70 = ZEXT1664(auVar62);
                                auVar117 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                                auVar68 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                                auVar66 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                auVar69 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                                auVar67 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                auVar72 = vmovdqa64_avx512f(local_a740);
                                uVar58 = local_a830;
                              }
                              auVar62 = auVar70._0_16_;
                              uVar25 = vptestmd_avx512f(auVar72,auVar72);
                              if ((short)uVar25 == 0) {
                                uVar51 = 0;
                              }
                              else {
                                p_Var6 = context->args->filter;
                                if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((local_a7b0->field_8).field_0x2 & 0x40) != 0)))) {
                                  in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                                  in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                  in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                                  (*p_Var6)((RTCFilterFunctionNArguments *)local_a800);
                                  auVar62 = vxorps_avx512vl(auVar62,auVar62);
                                  auVar70 = ZEXT1664(auVar62);
                                  auVar117 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                                  auVar68 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                                  auVar66 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                  auVar69 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                                  auVar67 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                  auVar72 = vmovdqa64_avx512f(local_a740);
                                  uVar58 = local_a830;
                                }
                                uVar51 = vptestmd_avx512f(auVar72,auVar72);
                                auVar72 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                bVar48 = (bool)((byte)uVar51 & 1);
                                auVar71._0_4_ =
                                     (uint)bVar48 * auVar72._0_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x200);
                                bVar48 = (bool)((byte)(uVar51 >> 1) & 1);
                                auVar71._4_4_ =
                                     (uint)bVar48 * auVar72._4_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x204);
                                bVar48 = (bool)((byte)(uVar51 >> 2) & 1);
                                auVar71._8_4_ =
                                     (uint)bVar48 * auVar72._8_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x208);
                                bVar48 = (bool)((byte)(uVar51 >> 3) & 1);
                                auVar71._12_4_ =
                                     (uint)bVar48 * auVar72._12_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x20c);
                                bVar48 = (bool)((byte)(uVar51 >> 4) & 1);
                                auVar71._16_4_ =
                                     (uint)bVar48 * auVar72._16_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x210);
                                bVar48 = (bool)((byte)(uVar51 >> 5) & 1);
                                auVar71._20_4_ =
                                     (uint)bVar48 * auVar72._20_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x214);
                                bVar48 = (bool)((byte)(uVar51 >> 6) & 1);
                                auVar71._24_4_ =
                                     (uint)bVar48 * auVar72._24_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x218);
                                bVar48 = (bool)((byte)(uVar51 >> 7) & 1);
                                auVar71._28_4_ =
                                     (uint)bVar48 * auVar72._28_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x21c);
                                bVar48 = (bool)((byte)(uVar51 >> 8) & 1);
                                auVar71._32_4_ =
                                     (uint)bVar48 * auVar72._32_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x220);
                                bVar48 = (bool)((byte)(uVar51 >> 9) & 1);
                                auVar71._36_4_ =
                                     (uint)bVar48 * auVar72._36_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x224);
                                bVar48 = (bool)((byte)(uVar51 >> 10) & 1);
                                auVar71._40_4_ =
                                     (uint)bVar48 * auVar72._40_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x228);
                                bVar48 = (bool)((byte)(uVar51 >> 0xb) & 1);
                                auVar71._44_4_ =
                                     (uint)bVar48 * auVar72._44_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x22c);
                                bVar48 = (bool)((byte)(uVar51 >> 0xc) & 1);
                                auVar71._48_4_ =
                                     (uint)bVar48 * auVar72._48_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x230);
                                bVar48 = (bool)((byte)(uVar51 >> 0xd) & 1);
                                auVar71._52_4_ =
                                     (uint)bVar48 * auVar72._52_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x234);
                                bVar48 = (bool)((byte)(uVar51 >> 0xe) & 1);
                                auVar71._56_4_ =
                                     (uint)bVar48 * auVar72._56_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x238);
                                bVar48 = SUB81(uVar51 >> 0xf,0);
                                auVar71._60_4_ =
                                     (uint)bVar48 * auVar72._60_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x23c);
                                *(undefined1 (*) [64])(pRStack_a7e8 + 0x200) = auVar71;
                              }
                              uVar53 = (ushort)uVar51;
                              bVar48 = (bool)((byte)uVar51 & 1);
                              in_ZMM8._0_4_ =
                                   (uint)bVar48 * *(int *)local_a810 |
                                   (uint)!bVar48 * local_a3c0._0_4_;
                              bVar48 = (bool)((byte)(uVar51 >> 1) & 1);
                              in_ZMM8._4_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 4) |
                                   (uint)!bVar48 * local_a3c0._4_4_;
                              bVar48 = (bool)((byte)(uVar51 >> 2) & 1);
                              in_ZMM8._8_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 8) |
                                   (uint)!bVar48 * local_a3c0._8_4_;
                              bVar48 = (bool)((byte)(uVar51 >> 3) & 1);
                              in_ZMM8._12_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0xc) |
                                   (uint)!bVar48 * local_a3c0._12_4_;
                              bVar48 = (bool)((byte)(uVar51 >> 4) & 1);
                              in_ZMM8._16_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x10) |
                                   (uint)!bVar48 * local_a3c0._16_4_;
                              bVar48 = (bool)((byte)(uVar51 >> 5) & 1);
                              in_ZMM8._20_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x14) |
                                   (uint)!bVar48 * local_a3c0._20_4_;
                              bVar48 = (bool)((byte)(uVar51 >> 6) & 1);
                              in_ZMM8._24_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x18) |
                                   (uint)!bVar48 * local_a3c0._24_4_;
                              bVar48 = (bool)((byte)(uVar51 >> 7) & 1);
                              in_ZMM8._28_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x1c) |
                                   (uint)!bVar48 * local_a3c0._28_4_;
                              bVar48 = (bool)((byte)(uVar51 >> 8) & 1);
                              in_ZMM8._32_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x20) |
                                   (uint)!bVar48 * local_a3c0._32_4_;
                              bVar48 = (bool)((byte)(uVar51 >> 9) & 1);
                              in_ZMM8._36_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x24) |
                                   (uint)!bVar48 * local_a3c0._36_4_;
                              bVar48 = (bool)((byte)(uVar51 >> 10) & 1);
                              in_ZMM8._40_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x28) |
                                   (uint)!bVar48 * local_a3c0._40_4_;
                              bVar48 = (bool)((byte)(uVar51 >> 0xb) & 1);
                              in_ZMM8._44_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x2c) |
                                   (uint)!bVar48 * local_a3c0._44_4_;
                              bVar48 = (bool)((byte)(uVar51 >> 0xc) & 1);
                              in_ZMM8._48_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x30) |
                                   (uint)!bVar48 * local_a3c0._48_4_;
                              bVar48 = (bool)((byte)(uVar51 >> 0xd) & 1);
                              in_ZMM8._52_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x34) |
                                   (uint)!bVar48 * local_a3c0._52_4_;
                              bVar48 = (bool)((byte)(uVar51 >> 0xe) & 1);
                              in_ZMM8._56_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x38) |
                                   (uint)!bVar48 * local_a3c0._56_4_;
                              bVar48 = SUB81(uVar51 >> 0xf,0);
                              in_ZMM8._60_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x3c) |
                                   (uint)!bVar48 * local_a3c0._60_4_;
                              *(undefined1 (*) [64])local_a810 = in_ZMM8;
                              lVar54 = local_a828;
                            }
                            uVar52 = (ulong)((uint)uVar52 & (uint)(ushort)~uVar53);
                            auVar72 = local_a640;
                          }
                        }
                      }
                      auVar71 = _local_a800;
                      uVar53 = (ushort)uVar52;
                      if (uVar53 == 0) {
LAB_00823f72:
                        uVar53 = 0;
                        break;
                      }
                      auVar70 = *(undefined1 (*) [64])ray;
                      auVar74 = *(undefined1 (*) [64])(ray + 0x40);
                      auVar73 = *(undefined1 (*) [64])(ray + 0x80);
                      auVar75 = *(undefined1 (*) [64])(ray + 0x100);
                      in_ZMM8 = *(undefined1 (*) [64])(ray + 0x140);
                      auVar76 = *(undefined1 (*) [64])(ray + 0x180);
                      auVar77 = vsubps_avx512f(local_a300,auVar70);
                      auVar78 = vsubps_avx512f(local_a340,auVar74);
                      in_ZMM9 = vsubps_avx512f(local_a380,auVar73);
                      auVar72 = vsubps_avx512f(auVar72,auVar70);
                      auVar79 = vsubps_avx512f(local_a780,auVar74);
                      auVar96 = vsubps_avx512f(local_a680,auVar73);
                      auVar70 = vsubps_avx512f(local_9ec0,auVar70);
                      auVar74 = vsubps_avx512f(local_9f00,auVar74);
                      auVar73 = vsubps_avx512f(local_9f40,auVar73);
                      auVar80 = vsubps_avx512f(auVar70,auVar77);
                      in_ZMM15 = vsubps_avx512f(auVar74,auVar78);
                      in_ZMM14 = vsubps_avx512f(auVar73,in_ZMM9);
                      auVar81 = vsubps_avx512f(auVar77,auVar72);
                      auVar82 = vsubps_avx512f(auVar78,auVar79);
                      auVar83 = vsubps_avx512f(in_ZMM9,auVar96);
                      auVar84 = vsubps_avx512f(auVar72,auVar70);
                      auVar85 = vsubps_avx512f(auVar79,auVar74);
                      auVar86 = vsubps_avx512f(auVar96,auVar73);
                      auVar87 = vaddps_avx512f(auVar70,auVar77);
                      auVar88 = vaddps_avx512f(auVar74,auVar78);
                      auVar89 = vaddps_avx512f(auVar73,in_ZMM9);
                      auVar90 = vmulps_avx512f(auVar88,in_ZMM14);
                      auVar90 = vfmsub231ps_avx512f(auVar90,in_ZMM15,auVar89);
                      auVar89 = vmulps_avx512f(auVar89,auVar80);
                      auVar89 = vfmsub231ps_avx512f(auVar89,in_ZMM14,auVar87);
                      auVar87 = vmulps_avx512f(auVar87,in_ZMM15);
                      auVar87 = vfmsub231ps_avx512f(auVar87,auVar80,auVar88);
                      auVar87 = vmulps_avx512f(auVar87,auVar76);
                      auVar87 = vfmadd231ps_avx512f(auVar87,in_ZMM8,auVar89);
                      auVar87 = vfmadd231ps_avx512f(auVar87,auVar75,auVar90);
                      auVar88 = vaddps_avx512f(auVar77,auVar72);
                      auVar89 = vaddps_avx512f(auVar78,auVar79);
                      auVar90 = vaddps_avx512f(in_ZMM9,auVar96);
                      auVar91 = vmulps_avx512f(auVar89,auVar83);
                      auVar91 = vfmsub231ps_avx512f(auVar91,auVar82,auVar90);
                      auVar90 = vmulps_avx512f(auVar90,auVar81);
                      auVar90 = vfmsub231ps_avx512f(auVar90,auVar83,auVar88);
                      auVar88 = vmulps_avx512f(auVar88,auVar82);
                      auVar88 = vfmsub231ps_avx512f(auVar88,auVar81,auVar89);
                      auVar88 = vmulps_avx512f(auVar88,auVar76);
                      auVar88 = vfmadd231ps_avx512f(auVar88,in_ZMM8,auVar90);
                      auVar88 = vfmadd231ps_avx512f(auVar88,auVar75,auVar91);
                      auVar70 = vaddps_avx512f(auVar72,auVar70);
                      auVar72 = vaddps_avx512f(auVar79,auVar74);
                      auVar74 = vaddps_avx512f(auVar96,auVar73);
                      auVar73 = vmulps_avx512f(auVar72,auVar86);
                      auVar73 = vfmsub231ps_avx512f(auVar73,auVar85,auVar74);
                      auVar74 = vmulps_avx512f(auVar74,auVar84);
                      auVar74 = vfmsub231ps_avx512f(auVar74,auVar86,auVar70);
                      auVar70 = vmulps_avx512f(auVar70,auVar85);
                      auVar70 = vfmsub231ps_avx512f(auVar70,auVar84,auVar72);
                      auVar70 = vmulps_avx512f(auVar70,auVar76);
                      auVar70 = vfmadd231ps_avx512f(auVar70,in_ZMM8,auVar74);
                      in_ZMM21 = vfmadd231ps_avx512f(auVar70,auVar75,auVar73);
                      auVar70 = vaddps_avx512f(auVar87,auVar88);
                      auVar72 = vaddps_avx512f(in_ZMM21,auVar70);
                      auVar74 = vandps_avx512dq(auVar72,auVar67);
                      auVar44._8_4_ = 0x34000000;
                      auVar44._0_8_ = 0x3400000034000000;
                      auVar44._12_4_ = 0x34000000;
                      auVar44._16_4_ = 0x34000000;
                      auVar44._20_4_ = 0x34000000;
                      auVar44._24_4_ = 0x34000000;
                      auVar44._28_4_ = 0x34000000;
                      auVar44._32_4_ = 0x34000000;
                      auVar44._36_4_ = 0x34000000;
                      auVar44._40_4_ = 0x34000000;
                      auVar44._44_4_ = 0x34000000;
                      auVar44._48_4_ = 0x34000000;
                      auVar44._52_4_ = 0x34000000;
                      auVar44._56_4_ = 0x34000000;
                      auVar44._60_4_ = 0x34000000;
                      auVar70 = vmulps_avx512f(auVar74,auVar44);
                      auVar73 = vminps_avx512f(auVar87,auVar88);
                      auVar73 = vminps_avx512f(auVar73,in_ZMM21);
                      auVar45._8_4_ = 0x80000000;
                      auVar45._0_8_ = 0x8000000080000000;
                      auVar45._12_4_ = 0x80000000;
                      auVar45._16_4_ = 0x80000000;
                      auVar45._20_4_ = 0x80000000;
                      auVar45._24_4_ = 0x80000000;
                      auVar45._28_4_ = 0x80000000;
                      auVar45._32_4_ = 0x80000000;
                      auVar45._36_4_ = 0x80000000;
                      auVar45._40_4_ = 0x80000000;
                      auVar45._44_4_ = 0x80000000;
                      auVar45._48_4_ = 0x80000000;
                      auVar45._52_4_ = 0x80000000;
                      auVar45._56_4_ = 0x80000000;
                      auVar45._60_4_ = 0x80000000;
                      auVar79 = vxorps_avx512dq(auVar70,auVar45);
                      uVar25 = vcmpps_avx512f(auVar73,auVar79,5);
                      auVar73 = vmaxps_avx512f(auVar87,auVar88);
                      in_ZMM20 = vmaxps_avx512f(auVar73,in_ZMM21);
                      uVar26 = vcmpps_avx512f(in_ZMM20,auVar70,2);
                      uVar49 = ((ushort)uVar25 | (ushort)uVar26) & uVar53;
                      auVar62 = auVar91._0_16_;
                      if (uVar49 == 0) {
                        auVar62 = vxorps_avx512vl(auVar62,auVar62);
                        auVar70 = ZEXT1664(auVar62);
                      }
                      else {
                        auVar70 = vmulps_avx512f(auVar82,in_ZMM14);
                        in_ZMM20 = vmulps_avx512f(auVar80,auVar83);
                        in_ZMM21 = vmulps_avx512f(auVar81,in_ZMM15);
                        auVar73 = vmulps_avx512f(auVar85,auVar83);
                        auVar79 = vmulps_avx512f(auVar81,auVar86);
                        auVar96 = vmulps_avx512f(auVar84,auVar82);
                        in_ZMM15 = vfmsub213ps_avx512f(in_ZMM15,auVar83,auVar70);
                        in_ZMM14 = vfmsub213ps_avx512f(in_ZMM14,auVar81,in_ZMM20);
                        auVar80 = vfmsub213ps_avx512f(auVar80,auVar82,in_ZMM21);
                        auVar82 = vfmsub213ps_avx512f(auVar86,auVar82,auVar73);
                        auVar83 = vfmsub213ps_avx512f(auVar84,auVar83,auVar79);
                        auVar81 = vfmsub213ps_avx512f(auVar85,auVar81,auVar96);
                        auVar70 = vandps_avx512dq(auVar70,auVar67);
                        auVar73 = vandps_avx512dq(auVar73,auVar67);
                        uVar51 = vcmpps_avx512f(auVar70,auVar73,1);
                        auVar70 = vandps_avx512dq(in_ZMM20,auVar67);
                        auVar73 = vandps_avx512dq(auVar79,auVar67);
                        uVar60 = vcmpps_avx512f(auVar70,auVar73,1);
                        auVar70 = vandps_avx512dq(in_ZMM21,auVar67);
                        auVar73 = vandps_avx512dq(auVar96,auVar67);
                        uVar23 = vcmpps_avx512f(auVar70,auVar73,1);
                        bVar48 = (bool)((byte)uVar51 & 1);
                        auVar97._0_4_ =
                             (uint)bVar48 * in_ZMM15._0_4_ | (uint)!bVar48 * auVar82._0_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 1) & 1);
                        auVar97._4_4_ =
                             (uint)bVar48 * in_ZMM15._4_4_ | (uint)!bVar48 * auVar82._4_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 2) & 1);
                        auVar97._8_4_ =
                             (uint)bVar48 * in_ZMM15._8_4_ | (uint)!bVar48 * auVar82._8_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 3) & 1);
                        auVar97._12_4_ =
                             (uint)bVar48 * in_ZMM15._12_4_ | (uint)!bVar48 * auVar82._12_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 4) & 1);
                        auVar97._16_4_ =
                             (uint)bVar48 * in_ZMM15._16_4_ | (uint)!bVar48 * auVar82._16_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 5) & 1);
                        auVar97._20_4_ =
                             (uint)bVar48 * in_ZMM15._20_4_ | (uint)!bVar48 * auVar82._20_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 6) & 1);
                        auVar97._24_4_ =
                             (uint)bVar48 * in_ZMM15._24_4_ | (uint)!bVar48 * auVar82._24_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 7) & 1);
                        auVar97._28_4_ =
                             (uint)bVar48 * in_ZMM15._28_4_ | (uint)!bVar48 * auVar82._28_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 8) & 1);
                        auVar97._32_4_ =
                             (uint)bVar48 * in_ZMM15._32_4_ | (uint)!bVar48 * auVar82._32_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 9) & 1);
                        auVar97._36_4_ =
                             (uint)bVar48 * in_ZMM15._36_4_ | (uint)!bVar48 * auVar82._36_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 10) & 1);
                        auVar97._40_4_ =
                             (uint)bVar48 * in_ZMM15._40_4_ | (uint)!bVar48 * auVar82._40_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 0xb) & 1);
                        auVar97._44_4_ =
                             (uint)bVar48 * in_ZMM15._44_4_ | (uint)!bVar48 * auVar82._44_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 0xc) & 1);
                        auVar97._48_4_ =
                             (uint)bVar48 * in_ZMM15._48_4_ | (uint)!bVar48 * auVar82._48_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 0xd) & 1);
                        auVar97._52_4_ =
                             (uint)bVar48 * in_ZMM15._52_4_ | (uint)!bVar48 * auVar82._52_4_;
                        bVar48 = (bool)((byte)(uVar51 >> 0xe) & 1);
                        auVar97._56_4_ =
                             (uint)bVar48 * in_ZMM15._56_4_ | (uint)!bVar48 * auVar82._56_4_;
                        bVar48 = SUB81(uVar51 >> 0xf,0);
                        auVar97._60_4_ =
                             (uint)bVar48 * in_ZMM15._60_4_ | (uint)!bVar48 * auVar82._60_4_;
                        bVar48 = (bool)((byte)uVar60 & 1);
                        auVar65._0_4_ =
                             (uint)bVar48 * in_ZMM14._0_4_ | (uint)!bVar48 * auVar83._0_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 1) & 1);
                        auVar65._4_4_ =
                             (uint)bVar48 * in_ZMM14._4_4_ | (uint)!bVar48 * auVar83._4_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 2) & 1);
                        auVar65._8_4_ =
                             (uint)bVar48 * in_ZMM14._8_4_ | (uint)!bVar48 * auVar83._8_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 3) & 1);
                        auVar65._12_4_ =
                             (uint)bVar48 * in_ZMM14._12_4_ | (uint)!bVar48 * auVar83._12_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 4) & 1);
                        auVar65._16_4_ =
                             (uint)bVar48 * in_ZMM14._16_4_ | (uint)!bVar48 * auVar83._16_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 5) & 1);
                        auVar65._20_4_ =
                             (uint)bVar48 * in_ZMM14._20_4_ | (uint)!bVar48 * auVar83._20_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 6) & 1);
                        auVar65._24_4_ =
                             (uint)bVar48 * in_ZMM14._24_4_ | (uint)!bVar48 * auVar83._24_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 7) & 1);
                        auVar65._28_4_ =
                             (uint)bVar48 * in_ZMM14._28_4_ | (uint)!bVar48 * auVar83._28_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 8) & 1);
                        auVar98._32_4_ =
                             (uint)bVar48 * in_ZMM14._32_4_ | (uint)!bVar48 * auVar83._32_4_;
                        auVar98._0_32_ = auVar65;
                        bVar48 = (bool)((byte)(uVar60 >> 9) & 1);
                        auVar98._36_4_ =
                             (uint)bVar48 * in_ZMM14._36_4_ | (uint)!bVar48 * auVar83._36_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 10) & 1);
                        auVar98._40_4_ =
                             (uint)bVar48 * in_ZMM14._40_4_ | (uint)!bVar48 * auVar83._40_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 0xb) & 1);
                        auVar98._44_4_ =
                             (uint)bVar48 * in_ZMM14._44_4_ | (uint)!bVar48 * auVar83._44_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 0xc) & 1);
                        auVar98._48_4_ =
                             (uint)bVar48 * in_ZMM14._48_4_ | (uint)!bVar48 * auVar83._48_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 0xd) & 1);
                        auVar98._52_4_ =
                             (uint)bVar48 * in_ZMM14._52_4_ | (uint)!bVar48 * auVar83._52_4_;
                        bVar48 = (bool)((byte)(uVar60 >> 0xe) & 1);
                        auVar98._56_4_ =
                             (uint)bVar48 * in_ZMM14._56_4_ | (uint)!bVar48 * auVar83._56_4_;
                        bVar48 = SUB81(uVar60 >> 0xf,0);
                        auVar98._60_4_ =
                             (uint)bVar48 * in_ZMM14._60_4_ | (uint)!bVar48 * auVar83._60_4_;
                        bVar48 = (bool)((byte)uVar23 & 1);
                        auVar99._0_4_ = (uint)bVar48 * auVar80._0_4_ | (uint)!bVar48 * auVar81._0_4_
                        ;
                        bVar48 = (bool)((byte)(uVar23 >> 1) & 1);
                        auVar99._4_4_ = (uint)bVar48 * auVar80._4_4_ | (uint)!bVar48 * auVar81._4_4_
                        ;
                        bVar48 = (bool)((byte)(uVar23 >> 2) & 1);
                        auVar99._8_4_ = (uint)bVar48 * auVar80._8_4_ | (uint)!bVar48 * auVar81._8_4_
                        ;
                        bVar48 = (bool)((byte)(uVar23 >> 3) & 1);
                        auVar99._12_4_ =
                             (uint)bVar48 * auVar80._12_4_ | (uint)!bVar48 * auVar81._12_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 4) & 1);
                        auVar99._16_4_ =
                             (uint)bVar48 * auVar80._16_4_ | (uint)!bVar48 * auVar81._16_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 5) & 1);
                        auVar99._20_4_ =
                             (uint)bVar48 * auVar80._20_4_ | (uint)!bVar48 * auVar81._20_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 6) & 1);
                        auVar99._24_4_ =
                             (uint)bVar48 * auVar80._24_4_ | (uint)!bVar48 * auVar81._24_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 7) & 1);
                        auVar99._28_4_ =
                             (uint)bVar48 * auVar80._28_4_ | (uint)!bVar48 * auVar81._28_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 8) & 1);
                        auVar99._32_4_ =
                             (uint)bVar48 * auVar80._32_4_ | (uint)!bVar48 * auVar81._32_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 9) & 1);
                        auVar99._36_4_ =
                             (uint)bVar48 * auVar80._36_4_ | (uint)!bVar48 * auVar81._36_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 10) & 1);
                        auVar99._40_4_ =
                             (uint)bVar48 * auVar80._40_4_ | (uint)!bVar48 * auVar81._40_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 0xb) & 1);
                        auVar99._44_4_ =
                             (uint)bVar48 * auVar80._44_4_ | (uint)!bVar48 * auVar81._44_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 0xc) & 1);
                        auVar99._48_4_ =
                             (uint)bVar48 * auVar80._48_4_ | (uint)!bVar48 * auVar81._48_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 0xd) & 1);
                        auVar99._52_4_ =
                             (uint)bVar48 * auVar80._52_4_ | (uint)!bVar48 * auVar81._52_4_;
                        bVar48 = (bool)((byte)(uVar23 >> 0xe) & 1);
                        auVar99._56_4_ =
                             (uint)bVar48 * auVar80._56_4_ | (uint)!bVar48 * auVar81._56_4_;
                        bVar48 = SUB81(uVar23 >> 0xf,0);
                        auVar99._60_4_ =
                             (uint)bVar48 * auVar80._60_4_ | (uint)!bVar48 * auVar81._60_4_;
                        auVar70 = vmulps_avx512f(auVar76,auVar99);
                        auVar70 = vfmadd213ps_avx512f(in_ZMM8,auVar98,auVar70);
                        auVar70 = vfmadd213ps_avx512f(auVar75,auVar97,auVar70);
                        auVar73 = vaddps_avx512f(auVar70,auVar70);
                        auVar70 = vmulps_avx512f(in_ZMM9,auVar99);
                        auVar70 = vfmadd213ps_avx512f(auVar78,auVar98,auVar70);
                        auVar70 = vfmadd213ps_avx512f(auVar77,auVar97,auVar70);
                        auVar75 = vrcp14ps_avx512f(auVar73);
                        auVar70 = vaddps_avx512f(auVar70,auVar70);
                        auVar76 = vfnmadd213ps_avx512f(auVar75,auVar73,auVar69);
                        auVar75 = vfmadd132ps_avx512f(auVar76,auVar75,auVar75);
                        auVar75 = vmulps_avx512f(auVar70,auVar75);
                        in_ZMM8 = *(undefined1 (*) [64])(ray + 0x200);
                        uVar25 = vcmpps_avx512f(auVar75,in_ZMM8,2);
                        uVar26 = vcmpps_avx512f(auVar75,*(undefined1 (*) [64])(ray + 0xc0),0xd);
                        auVar62 = vxorps_avx512vl(auVar62,auVar62);
                        auVar70 = ZEXT1664(auVar62);
                        uVar27 = vcmpps_avx512f(auVar73,auVar70,4);
                        uVar49 = uVar49 & (ushort)uVar25 & (ushort)uVar26 & (ushort)uVar27;
                        if (uVar49 != 0) {
                          pGVar4 = (context->scene->geometries).items
                                   [*(uint *)(lVar54 + 0x40 + lVar56 * 4)].ptr;
                          auVar73 = vpbroadcastd_avx512f(ZEXT416(pGVar4->mask));
                          uVar25 = vptestmd_avx512f(auVar73,*(undefined1 (*) [64])(ray + 0x240));
                          uVar49 = uVar49 & (ushort)uVar25;
                          uVar58 = local_a830;
                          if (uVar49 != 0) {
                            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                               (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar73 = vrcp14ps_avx512f(auVar72);
                              auVar46._8_4_ = 0x219392ef;
                              auVar46._0_8_ = 0x219392ef219392ef;
                              auVar46._12_4_ = 0x219392ef;
                              auVar46._16_4_ = 0x219392ef;
                              auVar46._20_4_ = 0x219392ef;
                              auVar46._24_4_ = 0x219392ef;
                              auVar46._28_4_ = 0x219392ef;
                              auVar46._32_4_ = 0x219392ef;
                              auVar46._36_4_ = 0x219392ef;
                              auVar46._40_4_ = 0x219392ef;
                              auVar46._44_4_ = 0x219392ef;
                              auVar46._48_4_ = 0x219392ef;
                              auVar46._52_4_ = 0x219392ef;
                              auVar46._56_4_ = 0x219392ef;
                              auVar46._60_4_ = 0x219392ef;
                              uVar58 = vcmpps_avx512f(auVar74,auVar46,5);
                              auVar72 = vfnmadd213ps_avx512f(auVar72,auVar73,auVar69);
                              auVar72 = vfmadd132ps_avx512f(auVar72,auVar73,auVar73);
                              auVar100._4_4_ = (uint)((byte)(uVar58 >> 1) & 1) * auVar72._4_4_;
                              auVar100._0_4_ = (uint)((byte)uVar58 & 1) * auVar72._0_4_;
                              auVar100._8_4_ = (uint)((byte)(uVar58 >> 2) & 1) * auVar72._8_4_;
                              auVar100._12_4_ = (uint)((byte)(uVar58 >> 3) & 1) * auVar72._12_4_;
                              auVar100._16_4_ = (uint)((byte)(uVar58 >> 4) & 1) * auVar72._16_4_;
                              auVar100._20_4_ = (uint)((byte)(uVar58 >> 5) & 1) * auVar72._20_4_;
                              auVar100._24_4_ = (uint)((byte)(uVar58 >> 6) & 1) * auVar72._24_4_;
                              auVar100._28_4_ = (uint)((byte)(uVar58 >> 7) & 1) * auVar72._28_4_;
                              auVar100._32_4_ = (uint)((byte)(uVar58 >> 8) & 1) * auVar72._32_4_;
                              auVar100._36_4_ = (uint)((byte)(uVar58 >> 9) & 1) * auVar72._36_4_;
                              auVar100._40_4_ = (uint)((byte)(uVar58 >> 10) & 1) * auVar72._40_4_;
                              auVar100._44_4_ = (uint)((byte)(uVar58 >> 0xb) & 1) * auVar72._44_4_;
                              auVar100._48_4_ = (uint)((byte)(uVar58 >> 0xc) & 1) * auVar72._48_4_;
                              auVar100._52_4_ = (uint)((byte)(uVar58 >> 0xd) & 1) * auVar72._52_4_;
                              auVar100._56_4_ = (uint)((byte)(uVar58 >> 0xe) & 1) * auVar72._56_4_;
                              auVar100._60_4_ = (uint)(byte)(uVar58 >> 0xf) * auVar72._60_4_;
                              auVar72 = vmulps_avx512f(auVar87,auVar100);
                              auVar72 = vminps_avx512f(auVar72,auVar69);
                              auVar74 = vmulps_avx512f(auVar88,auVar100);
                              auVar74 = vminps_avx512f(auVar74,auVar69);
                              local_a540 = vsubps_avx512f(auVar69,auVar72);
                              local_a500 = vsubps_avx512f(auVar69,auVar74);
                              pRVar5 = context->user;
                              auVar72 = vpbroadcastd_avx512f();
                              auVar74 = vpbroadcastd_avx512f();
                              local_a600 = auVar97;
                              local_a5c0 = auVar98;
                              local_a580 = auVar99;
                              local_a4c0 = vmovdqa64_avx512f(auVar74);
                              local_a480 = vmovdqa64_avx512f(auVar72);
                              auVar65 = vpcmpeqd_avx2(auVar65,auVar65);
                              local_a7b8[3] = auVar65;
                              local_a7b8[2] = auVar65;
                              local_a7b8[1] = auVar65;
                              *local_a7b8 = auVar65;
                              local_a440 = vbroadcastss_avx512f(ZEXT416(pRVar5->instID[0]));
                              local_a400 = vbroadcastss_avx512f(ZEXT416(pRVar5->instPrimID[0]));
                              auVar72 = vblendmps_avx512f(in_ZMM8,auVar75);
                              bVar48 = (bool)((byte)uVar49 & 1);
                              bVar7 = (bool)((byte)(uVar49 >> 1) & 1);
                              bVar8 = (bool)((byte)(uVar49 >> 2) & 1);
                              bVar9 = (bool)((byte)(uVar49 >> 3) & 1);
                              bVar10 = (bool)((byte)(uVar49 >> 4) & 1);
                              bVar11 = (bool)((byte)(uVar49 >> 5) & 1);
                              bVar12 = (bool)((byte)(uVar49 >> 6) & 1);
                              bVar13 = (bool)((byte)(uVar49 >> 7) & 1);
                              bVar14 = (byte)(uVar49 >> 8);
                              bVar15 = (bool)(bVar14 >> 1 & 1);
                              bVar16 = (bool)(bVar14 >> 2 & 1);
                              bVar17 = (bool)(bVar14 >> 3 & 1);
                              bVar18 = (bool)(bVar14 >> 4 & 1);
                              bVar19 = (bool)(bVar14 >> 5 & 1);
                              bVar20 = (bool)(bVar14 >> 6 & 1);
                              *(uint *)(ray + 0x200) =
                                   (uint)bVar48 * auVar72._0_4_ | (uint)!bVar48 * local_a400._0_4_;
                              *(uint *)(ray + 0x204) =
                                   (uint)bVar7 * auVar72._4_4_ | (uint)!bVar7 * local_a400._4_4_;
                              *(uint *)(ray + 0x208) =
                                   (uint)bVar8 * auVar72._8_4_ | (uint)!bVar8 * local_a400._8_4_;
                              *(uint *)(ray + 0x20c) =
                                   (uint)bVar9 * auVar72._12_4_ | (uint)!bVar9 * local_a400._12_4_;
                              *(uint *)(ray + 0x210) =
                                   (uint)bVar10 * auVar72._16_4_ | (uint)!bVar10 * local_a400._16_4_
                              ;
                              *(uint *)(ray + 0x214) =
                                   (uint)bVar11 * auVar72._20_4_ | (uint)!bVar11 * local_a400._20_4_
                              ;
                              *(uint *)(ray + 0x218) =
                                   (uint)bVar12 * auVar72._24_4_ | (uint)!bVar12 * local_a400._24_4_
                              ;
                              *(uint *)(ray + 0x21c) =
                                   (uint)bVar13 * auVar72._28_4_ | (uint)!bVar13 * local_a400._28_4_
                              ;
                              *(uint *)(ray + 0x220) =
                                   (uint)(bVar14 & 1) * auVar72._32_4_ |
                                   (uint)!(bool)(bVar14 & 1) * local_a400._32_4_;
                              *(uint *)(ray + 0x224) =
                                   (uint)bVar15 * auVar72._36_4_ | (uint)!bVar15 * local_a400._36_4_
                              ;
                              *(uint *)(ray + 0x228) =
                                   (uint)bVar16 * auVar72._40_4_ | (uint)!bVar16 * local_a400._40_4_
                              ;
                              *(uint *)(ray + 0x22c) =
                                   (uint)bVar17 * auVar72._44_4_ | (uint)!bVar17 * local_a400._44_4_
                              ;
                              *(uint *)(ray + 0x230) =
                                   (uint)bVar18 * auVar72._48_4_ | (uint)!bVar18 * local_a400._48_4_
                              ;
                              *(uint *)(ray + 0x234) =
                                   (uint)bVar19 * auVar72._52_4_ | (uint)!bVar19 * local_a400._52_4_
                              ;
                              *(uint *)(ray + 0x238) =
                                   (uint)bVar20 * auVar72._56_4_ | (uint)!bVar20 * local_a400._56_4_
                              ;
                              *(uint *)(ray + 0x23c) =
                                   (uint)(uVar49 >> 0xf) * auVar72._60_4_ |
                                   (uint)!(bool)(bVar14 >> 7) * local_a400._60_4_;
                              auVar72 = vpmovm2d_avx512dq((ulong)uVar49);
                              local_a740 = vmovdqa64_avx512f(auVar72);
                              local_a800._8_8_ = pGVar4->userPtr;
                              local_a800._0_8_ = local_a740;
                              pRStack_a7f0 = context->user;
                              pRStack_a7e8 = ray;
                              puStack_a7e0 = local_a600;
                              auStack_a7d4 = auVar71._44_20_;
                              uStack_a7d8 = 0x10;
                              local_a780 = in_ZMM8;
                              local_a828 = lVar54;
                              if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                                in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                                local_a838 = lVar56;
                                (*pGVar4->occlusionFilterN)
                                          ((RTCFilterFunctionNArguments *)local_a800);
                                auVar62 = vxorps_avx512vl(auVar62,auVar62);
                                auVar70 = ZEXT1664(auVar62);
                                auVar117 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                                auVar68 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                                auVar66 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                auVar69 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                                auVar67 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                auVar72 = vmovdqa64_avx512f(local_a740);
                                lVar56 = local_a838;
                              }
                              auVar62 = auVar70._0_16_;
                              uVar25 = vptestmd_avx512f(auVar72,auVar72);
                              if ((short)uVar25 == 0) {
                                uVar58 = 0;
                              }
                              else {
                                p_Var6 = context->args->filter;
                                if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                  in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                                  in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                  in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                                  (*p_Var6)((RTCFilterFunctionNArguments *)local_a800);
                                  auVar62 = vxorps_avx512vl(auVar62,auVar62);
                                  auVar70 = ZEXT1664(auVar62);
                                  auVar117 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                                  auVar68 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                                  auVar66 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                  auVar69 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                                  auVar67 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                  auVar72 = vmovdqa64_avx512f(local_a740);
                                }
                                uVar58 = vptestmd_avx512f(auVar72,auVar72);
                                auVar71 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                bVar48 = (bool)((byte)uVar58 & 1);
                                auVar101._0_4_ =
                                     (uint)bVar48 * auVar71._0_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x200);
                                bVar48 = (bool)((byte)(uVar58 >> 1) & 1);
                                auVar101._4_4_ =
                                     (uint)bVar48 * auVar71._4_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x204);
                                bVar48 = (bool)((byte)(uVar58 >> 2) & 1);
                                auVar101._8_4_ =
                                     (uint)bVar48 * auVar71._8_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x208);
                                bVar48 = (bool)((byte)(uVar58 >> 3) & 1);
                                auVar101._12_4_ =
                                     (uint)bVar48 * auVar71._12_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x20c);
                                bVar48 = (bool)((byte)(uVar58 >> 4) & 1);
                                auVar101._16_4_ =
                                     (uint)bVar48 * auVar71._16_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x210);
                                bVar48 = (bool)((byte)(uVar58 >> 5) & 1);
                                auVar101._20_4_ =
                                     (uint)bVar48 * auVar71._20_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x214);
                                bVar48 = (bool)((byte)(uVar58 >> 6) & 1);
                                auVar101._24_4_ =
                                     (uint)bVar48 * auVar71._24_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x218);
                                bVar48 = (bool)((byte)(uVar58 >> 7) & 1);
                                auVar101._28_4_ =
                                     (uint)bVar48 * auVar71._28_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x21c);
                                bVar48 = (bool)((byte)(uVar58 >> 8) & 1);
                                auVar101._32_4_ =
                                     (uint)bVar48 * auVar71._32_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x220);
                                bVar48 = (bool)((byte)(uVar58 >> 9) & 1);
                                auVar101._36_4_ =
                                     (uint)bVar48 * auVar71._36_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x224);
                                bVar48 = (bool)((byte)(uVar58 >> 10) & 1);
                                auVar101._40_4_ =
                                     (uint)bVar48 * auVar71._40_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x228);
                                bVar48 = (bool)((byte)(uVar58 >> 0xb) & 1);
                                auVar101._44_4_ =
                                     (uint)bVar48 * auVar71._44_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x22c);
                                bVar48 = (bool)((byte)(uVar58 >> 0xc) & 1);
                                auVar101._48_4_ =
                                     (uint)bVar48 * auVar71._48_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x230);
                                bVar48 = (bool)((byte)(uVar58 >> 0xd) & 1);
                                auVar101._52_4_ =
                                     (uint)bVar48 * auVar71._52_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x234);
                                bVar48 = (bool)((byte)(uVar58 >> 0xe) & 1);
                                auVar101._56_4_ =
                                     (uint)bVar48 * auVar71._56_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x238);
                                bVar48 = SUB81(uVar58 >> 0xf,0);
                                auVar101._60_4_ =
                                     (uint)bVar48 * auVar71._60_4_ |
                                     (uint)!bVar48 * *(int *)(pRStack_a7e8 + 0x23c);
                                *(undefined1 (*) [64])(pRStack_a7e8 + 0x200) = auVar101;
                              }
                              uVar49 = (ushort)uVar58;
                              bVar48 = (bool)((byte)uVar58 & 1);
                              in_ZMM8._0_4_ =
                                   (uint)bVar48 * *(int *)local_a810 |
                                   (uint)!bVar48 * local_a780._0_4_;
                              bVar48 = (bool)((byte)(uVar58 >> 1) & 1);
                              in_ZMM8._4_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 4) |
                                   (uint)!bVar48 * local_a780._4_4_;
                              bVar48 = (bool)((byte)(uVar58 >> 2) & 1);
                              in_ZMM8._8_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 8) |
                                   (uint)!bVar48 * local_a780._8_4_;
                              bVar48 = (bool)((byte)(uVar58 >> 3) & 1);
                              in_ZMM8._12_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0xc) |
                                   (uint)!bVar48 * local_a780._12_4_;
                              bVar48 = (bool)((byte)(uVar58 >> 4) & 1);
                              in_ZMM8._16_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x10) |
                                   (uint)!bVar48 * local_a780._16_4_;
                              bVar48 = (bool)((byte)(uVar58 >> 5) & 1);
                              in_ZMM8._20_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x14) |
                                   (uint)!bVar48 * local_a780._20_4_;
                              bVar48 = (bool)((byte)(uVar58 >> 6) & 1);
                              in_ZMM8._24_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x18) |
                                   (uint)!bVar48 * local_a780._24_4_;
                              bVar48 = (bool)((byte)(uVar58 >> 7) & 1);
                              in_ZMM8._28_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x1c) |
                                   (uint)!bVar48 * local_a780._28_4_;
                              bVar48 = (bool)((byte)(uVar58 >> 8) & 1);
                              in_ZMM8._32_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x20) |
                                   (uint)!bVar48 * local_a780._32_4_;
                              bVar48 = (bool)((byte)(uVar58 >> 9) & 1);
                              in_ZMM8._36_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x24) |
                                   (uint)!bVar48 * local_a780._36_4_;
                              bVar48 = (bool)((byte)(uVar58 >> 10) & 1);
                              in_ZMM8._40_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x28) |
                                   (uint)!bVar48 * local_a780._40_4_;
                              bVar48 = (bool)((byte)(uVar58 >> 0xb) & 1);
                              in_ZMM8._44_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x2c) |
                                   (uint)!bVar48 * local_a780._44_4_;
                              bVar48 = (bool)((byte)(uVar58 >> 0xc) & 1);
                              in_ZMM8._48_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x30) |
                                   (uint)!bVar48 * local_a780._48_4_;
                              bVar48 = (bool)((byte)(uVar58 >> 0xd) & 1);
                              in_ZMM8._52_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x34) |
                                   (uint)!bVar48 * local_a780._52_4_;
                              bVar48 = (bool)((byte)(uVar58 >> 0xe) & 1);
                              in_ZMM8._56_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x38) |
                                   (uint)!bVar48 * local_a780._56_4_;
                              bVar48 = SUB81(uVar58 >> 0xf,0);
                              in_ZMM8._60_4_ =
                                   (uint)bVar48 * *(int *)(local_a810 + 0x3c) |
                                   (uint)!bVar48 * local_a780._60_4_;
                              *(undefined1 (*) [64])local_a810 = in_ZMM8;
                              lVar54 = local_a828;
                            }
                            uVar52 = (ulong)(uVar53 & ~uVar49);
                            uVar58 = local_a830;
                            if ((uVar53 & ~uVar49) == 0) goto LAB_00823f72;
                          }
                        }
                      }
                      uVar53 = (ushort)uVar52;
                      lVar56 = lVar56 + 1;
                    } while (lVar56 != 4);
                    uVar50 = (uint)(local_a85c & uVar53);
                  } while (((local_a85c & uVar53) != 0) &&
                          (uVar58 = uVar58 + 1, uVar58 < local_a790));
                  uVar50 = ~uVar50;
                }
                local_a864 = local_a864 | uVar50;
                if ((short)local_a864 == -1) {
                  local_a864 = 0xffff;
                  goto LAB_008240e3;
                }
                auVar71 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                bVar48 = (bool)((byte)local_a864 & 1);
                bVar7 = (bool)((byte)(local_a864 >> 1) & 1);
                bVar8 = (bool)((byte)(local_a864 >> 2) & 1);
                bVar9 = (bool)((byte)(local_a864 >> 3) & 1);
                bVar10 = (bool)((byte)(local_a864 >> 4) & 1);
                bVar11 = (bool)((byte)(local_a864 >> 5) & 1);
                bVar12 = (bool)((byte)(local_a864 >> 6) & 1);
                bVar13 = (bool)((byte)(local_a864 >> 7) & 1);
                bVar15 = (bool)((byte)(local_a864 >> 8) & 1);
                bVar16 = (bool)((byte)(local_a864 >> 9) & 1);
                bVar17 = (bool)((byte)(local_a864 >> 10) & 1);
                bVar18 = (bool)((byte)(local_a864 >> 0xb) & 1);
                bVar19 = (bool)((byte)(local_a864 >> 0xc) & 1);
                bVar20 = (bool)((byte)(local_a864 >> 0xd) & 1);
                bVar21 = (bool)((byte)(local_a864 >> 0xe) & 1);
                bVar22 = (bool)((byte)(local_a864 >> 0xf) & 1);
                local_9f80._4_4_ = (uint)bVar7 * auVar71._4_4_ | (uint)!bVar7 * local_9f80._4_4_;
                local_9f80._0_4_ = (uint)bVar48 * auVar71._0_4_ | (uint)!bVar48 * local_9f80._0_4_;
                local_9f80._8_4_ = (uint)bVar8 * auVar71._8_4_ | (uint)!bVar8 * local_9f80._8_4_;
                local_9f80._12_4_ = (uint)bVar9 * auVar71._12_4_ | (uint)!bVar9 * local_9f80._12_4_;
                local_9f80._16_4_ =
                     (uint)bVar10 * auVar71._16_4_ | (uint)!bVar10 * local_9f80._16_4_;
                local_9f80._20_4_ =
                     (uint)bVar11 * auVar71._20_4_ | (uint)!bVar11 * local_9f80._20_4_;
                local_9f80._24_4_ =
                     (uint)bVar12 * auVar71._24_4_ | (uint)!bVar12 * local_9f80._24_4_;
                local_9f80._28_4_ =
                     (uint)bVar13 * auVar71._28_4_ | (uint)!bVar13 * local_9f80._28_4_;
                local_9f80._32_4_ =
                     (uint)bVar15 * auVar71._32_4_ | (uint)!bVar15 * local_9f80._32_4_;
                local_9f80._36_4_ =
                     (uint)bVar16 * auVar71._36_4_ | (uint)!bVar16 * local_9f80._36_4_;
                local_9f80._40_4_ =
                     (uint)bVar17 * auVar71._40_4_ | (uint)!bVar17 * local_9f80._40_4_;
                local_9f80._44_4_ =
                     (uint)bVar18 * auVar71._44_4_ | (uint)!bVar18 * local_9f80._44_4_;
                local_9f80._48_4_ =
                     (uint)bVar19 * auVar71._48_4_ | (uint)!bVar19 * local_9f80._48_4_;
                local_9f80._52_4_ =
                     (uint)bVar20 * auVar71._52_4_ | (uint)!bVar20 * local_9f80._52_4_;
                local_9f80._56_4_ =
                     (uint)bVar21 * auVar71._56_4_ | (uint)!bVar21 * local_9f80._56_4_;
                local_9f80._60_4_ =
                     (uint)bVar22 * auVar71._60_4_ | (uint)!bVar22 * local_9f80._60_4_;
              }
              goto LAB_0082297c;
            }
            uVar51 = root.ptr & 0xfffffffffffffff0;
            auVar71 = auVar66;
            do {
              uVar52 = *(ulong *)(uVar51 + 0x40 + lVar54 * 2);
              if (uVar52 == 8) break;
              auVar73 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar51 + 0x120 + lVar54)));
              auVar72 = *(undefined1 (*) [64])(ray + 0x1c0);
              uVar1 = *(undefined4 *)(uVar51 + 0x60 + lVar54);
              auVar74._4_4_ = uVar1;
              auVar74._0_4_ = uVar1;
              auVar74._8_4_ = uVar1;
              auVar74._12_4_ = uVar1;
              auVar74._16_4_ = uVar1;
              auVar74._20_4_ = uVar1;
              auVar74._24_4_ = uVar1;
              auVar74._28_4_ = uVar1;
              auVar74._32_4_ = uVar1;
              auVar74._36_4_ = uVar1;
              auVar74._40_4_ = uVar1;
              auVar74._44_4_ = uVar1;
              auVar74._48_4_ = uVar1;
              auVar74._52_4_ = uVar1;
              auVar74._56_4_ = uVar1;
              auVar74._60_4_ = uVar1;
              auVar74 = vfmadd213ps_avx512f(auVar73,auVar72,auVar74);
              auVar75 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar51 + 0x160 + lVar54)));
              uVar1 = *(undefined4 *)(uVar51 + 0xa0 + lVar54);
              auVar73._4_4_ = uVar1;
              auVar73._0_4_ = uVar1;
              auVar73._8_4_ = uVar1;
              auVar73._12_4_ = uVar1;
              auVar73._16_4_ = uVar1;
              auVar73._20_4_ = uVar1;
              auVar73._24_4_ = uVar1;
              auVar73._28_4_ = uVar1;
              auVar73._32_4_ = uVar1;
              auVar73._36_4_ = uVar1;
              auVar73._40_4_ = uVar1;
              auVar73._44_4_ = uVar1;
              auVar73._48_4_ = uVar1;
              auVar73._52_4_ = uVar1;
              auVar73._56_4_ = uVar1;
              auVar73._60_4_ = uVar1;
              auVar73 = vfmadd213ps_avx512f(auVar75,auVar72,auVar73);
              auVar76 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar51 + 0x1a0 + lVar54)));
              uVar1 = *(undefined4 *)(uVar51 + 0xe0 + lVar54);
              auVar75._4_4_ = uVar1;
              auVar75._0_4_ = uVar1;
              auVar75._8_4_ = uVar1;
              auVar75._12_4_ = uVar1;
              auVar75._16_4_ = uVar1;
              auVar75._20_4_ = uVar1;
              auVar75._24_4_ = uVar1;
              auVar75._28_4_ = uVar1;
              auVar75._32_4_ = uVar1;
              auVar75._36_4_ = uVar1;
              auVar75._40_4_ = uVar1;
              auVar75._44_4_ = uVar1;
              auVar75._48_4_ = uVar1;
              auVar75._52_4_ = uVar1;
              auVar75._56_4_ = uVar1;
              auVar75._60_4_ = uVar1;
              auVar75 = vfmadd213ps_avx512f(auVar76,auVar72,auVar75);
              auVar77 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar51 + 0x140 + lVar54)));
              uVar1 = *(undefined4 *)(uVar51 + 0x80 + lVar54);
              auVar76._4_4_ = uVar1;
              auVar76._0_4_ = uVar1;
              auVar76._8_4_ = uVar1;
              auVar76._12_4_ = uVar1;
              auVar76._16_4_ = uVar1;
              auVar76._20_4_ = uVar1;
              auVar76._24_4_ = uVar1;
              auVar76._28_4_ = uVar1;
              auVar76._32_4_ = uVar1;
              auVar76._36_4_ = uVar1;
              auVar76._40_4_ = uVar1;
              auVar76._44_4_ = uVar1;
              auVar76._48_4_ = uVar1;
              auVar76._52_4_ = uVar1;
              auVar76._56_4_ = uVar1;
              auVar76._60_4_ = uVar1;
              auVar76 = vfmadd213ps_avx512f(auVar77,auVar72,auVar76);
              auVar78 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar51 + 0x180 + lVar54)));
              uVar1 = *(undefined4 *)(uVar51 + 0xc0 + lVar54);
              auVar77._4_4_ = uVar1;
              auVar77._0_4_ = uVar1;
              auVar77._8_4_ = uVar1;
              auVar77._12_4_ = uVar1;
              auVar77._16_4_ = uVar1;
              auVar77._20_4_ = uVar1;
              auVar77._24_4_ = uVar1;
              auVar77._28_4_ = uVar1;
              auVar77._32_4_ = uVar1;
              auVar77._36_4_ = uVar1;
              auVar77._40_4_ = uVar1;
              auVar77._44_4_ = uVar1;
              auVar77._48_4_ = uVar1;
              auVar77._52_4_ = uVar1;
              auVar77._56_4_ = uVar1;
              auVar77._60_4_ = uVar1;
              auVar77 = vfmadd213ps_avx512f(auVar78,auVar72,auVar77);
              auVar79 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar51 + 0x1c0 + lVar54)));
              uVar1 = *(undefined4 *)(uVar51 + 0x100 + lVar54);
              auVar78._4_4_ = uVar1;
              auVar78._0_4_ = uVar1;
              auVar78._8_4_ = uVar1;
              auVar78._12_4_ = uVar1;
              auVar78._16_4_ = uVar1;
              auVar78._20_4_ = uVar1;
              auVar78._24_4_ = uVar1;
              auVar78._28_4_ = uVar1;
              auVar78._32_4_ = uVar1;
              auVar78._36_4_ = uVar1;
              auVar78._40_4_ = uVar1;
              auVar78._44_4_ = uVar1;
              auVar78._48_4_ = uVar1;
              auVar78._52_4_ = uVar1;
              auVar78._56_4_ = uVar1;
              auVar78._60_4_ = uVar1;
              in_ZMM8 = vfmadd213ps_avx512f(auVar79,auVar72,auVar78);
              in_ZMM9._8_8_ = local_a2c0._8_8_;
              in_ZMM9._0_8_ = local_a2c0._0_8_;
              in_ZMM9._16_8_ = local_a2c0._16_8_;
              in_ZMM9._24_8_ = local_a2c0._24_8_;
              in_ZMM9._32_8_ = local_a2c0._32_8_;
              in_ZMM9._40_8_ = local_a2c0._40_8_;
              in_ZMM9._48_8_ = local_a2c0._48_8_;
              in_ZMM9._56_8_ = local_a2c0._56_8_;
              auVar79._8_8_ = local_a2c0._72_8_;
              auVar79._0_8_ = local_a2c0._64_8_;
              auVar79._16_8_ = local_a2c0._80_8_;
              auVar79._24_8_ = local_a2c0._88_8_;
              auVar79._32_8_ = local_a2c0._96_8_;
              auVar79._40_8_ = local_a2c0._104_8_;
              auVar79._48_8_ = local_a2c0._112_8_;
              auVar79._56_8_ = local_a2c0._120_8_;
              auVar96._8_8_ = local_a2c0._136_8_;
              auVar96._0_8_ = local_a2c0._128_8_;
              auVar96._16_8_ = local_a2c0._144_8_;
              auVar96._24_8_ = local_a2c0._152_8_;
              auVar96._32_8_ = local_a2c0._160_8_;
              auVar96._40_8_ = local_a2c0._168_8_;
              auVar96._48_8_ = local_a2c0._176_8_;
              auVar96._56_8_ = local_a2c0._184_8_;
              auVar74 = vsubps_avx512f(auVar74,in_ZMM9);
              auVar74 = vmulps_avx512f(auVar74,local_a140);
              auVar73 = vsubps_avx512f(auVar73,auVar79);
              in_ZMM14 = vmulps_avx512f(auVar73,local_a100);
              auVar73 = vsubps_avx512f(auVar75,auVar96);
              in_ZMM15 = vmulps_avx512f(auVar73,local_a0c0);
              auVar73 = vsubps_avx512f(auVar76,in_ZMM9);
              auVar73 = vmulps_avx512f(auVar73,local_a140);
              auVar75 = vsubps_avx512f(auVar77,auVar79);
              auVar75 = vmulps_avx512f(auVar75,local_a100);
              auVar76 = vsubps_avx512f(in_ZMM8,auVar96);
              auVar76 = vmulps_avx512f(auVar76,local_a0c0);
              auVar77 = vpminsd_avx512f(auVar74,auVar73);
              auVar78 = vpminsd_avx512f(in_ZMM14,auVar75);
              auVar77 = vpmaxsd_avx512f(auVar77,auVar78);
              auVar78 = vpminsd_avx512f(in_ZMM15,auVar76);
              auVar77 = vpmaxsd_avx512f(auVar77,auVar78);
              auVar77 = vmulps_avx512f(auVar77,auVar68);
              auVar74 = vpmaxsd_avx512f(auVar74,auVar73);
              auVar73 = vpmaxsd_avx512f(in_ZMM14,auVar75);
              auVar74 = vpminsd_avx512f(auVar74,auVar73);
              auVar73 = vpmaxsd_avx512f(in_ZMM15,auVar76);
              auVar74 = vpminsd_avx512f(auVar74,auVar73);
              auVar74 = vmulps_avx512f(auVar74,auVar117);
              auVar80._4_4_ = uStack_9fbc;
              auVar80._0_4_ = local_9fc0;
              auVar80._8_4_ = uStack_9fb8;
              auVar80._12_4_ = uStack_9fb4;
              auVar80._16_4_ = uStack_9fb0;
              auVar80._20_4_ = uStack_9fac;
              auVar80._24_4_ = uStack_9fa8;
              auVar80._28_4_ = uStack_9fa4;
              auVar80._32_4_ = uStack_9fa0;
              auVar80._36_4_ = uStack_9f9c;
              auVar80._40_4_ = uStack_9f98;
              auVar80._44_4_ = uStack_9f94;
              auVar80._48_4_ = uStack_9f90;
              auVar80._52_4_ = uStack_9f8c;
              auVar80._56_4_ = uStack_9f88;
              auVar80._60_4_ = uStack_9f84;
              auVar73 = vpmaxsd_avx512f(auVar77,auVar80);
              auVar74 = vpminsd_avx512f(auVar74,local_9f80);
              uVar60 = vcmpps_avx512f(auVar73,auVar74,2);
              if (((uint)root.ptr & 7) == 6) {
                uVar1 = *(undefined4 *)(uVar51 + 0x1e0 + lVar54);
                auVar81._4_4_ = uVar1;
                auVar81._0_4_ = uVar1;
                auVar81._8_4_ = uVar1;
                auVar81._12_4_ = uVar1;
                auVar81._16_4_ = uVar1;
                auVar81._20_4_ = uVar1;
                auVar81._24_4_ = uVar1;
                auVar81._28_4_ = uVar1;
                auVar81._32_4_ = uVar1;
                auVar81._36_4_ = uVar1;
                auVar81._40_4_ = uVar1;
                auVar81._44_4_ = uVar1;
                auVar81._48_4_ = uVar1;
                auVar81._52_4_ = uVar1;
                auVar81._56_4_ = uVar1;
                auVar81._60_4_ = uVar1;
                uVar23 = vcmpps_avx512f(auVar72,auVar81,0xd);
                uVar1 = *(undefined4 *)(uVar51 + 0x200 + lVar54);
                auVar82._4_4_ = uVar1;
                auVar82._0_4_ = uVar1;
                auVar82._8_4_ = uVar1;
                auVar82._12_4_ = uVar1;
                auVar82._16_4_ = uVar1;
                auVar82._20_4_ = uVar1;
                auVar82._24_4_ = uVar1;
                auVar82._28_4_ = uVar1;
                auVar82._32_4_ = uVar1;
                auVar82._36_4_ = uVar1;
                auVar82._40_4_ = uVar1;
                auVar82._44_4_ = uVar1;
                auVar82._48_4_ = uVar1;
                auVar82._52_4_ = uVar1;
                auVar82._56_4_ = uVar1;
                auVar82._60_4_ = uVar1;
                uVar24 = vcmpps_avx512f(auVar72,auVar82,1);
                uVar60 = uVar60 & uVar23 & uVar24;
              }
              uVar23 = vcmpps_avx512f(local_9f80,local_a780,6);
              uVar60 = uVar60 & uVar23;
              uVar23 = uVar58;
              auVar83 = auVar71;
              if ((short)uVar60 != 0) {
                auVar74 = vblendmps_avx512f(auVar66,auVar77);
                bVar48 = (bool)((byte)uVar60 & 1);
                auVar83._0_4_ = (uint)bVar48 * auVar74._0_4_ | (uint)!bVar48 * auVar72._0_4_;
                bVar48 = (bool)((byte)(uVar60 >> 1) & 1);
                auVar83._4_4_ = (uint)bVar48 * auVar74._4_4_ | (uint)!bVar48 * auVar72._4_4_;
                bVar48 = (bool)((byte)(uVar60 >> 2) & 1);
                auVar83._8_4_ = (uint)bVar48 * auVar74._8_4_ | (uint)!bVar48 * auVar72._8_4_;
                bVar48 = (bool)((byte)(uVar60 >> 3) & 1);
                auVar83._12_4_ = (uint)bVar48 * auVar74._12_4_ | (uint)!bVar48 * auVar72._12_4_;
                bVar48 = (bool)((byte)(uVar60 >> 4) & 1);
                auVar83._16_4_ = (uint)bVar48 * auVar74._16_4_ | (uint)!bVar48 * auVar72._16_4_;
                bVar48 = (bool)((byte)(uVar60 >> 5) & 1);
                auVar83._20_4_ = (uint)bVar48 * auVar74._20_4_ | (uint)!bVar48 * auVar72._20_4_;
                bVar48 = (bool)((byte)(uVar60 >> 6) & 1);
                auVar83._24_4_ = (uint)bVar48 * auVar74._24_4_ | (uint)!bVar48 * auVar72._24_4_;
                bVar48 = (bool)((byte)(uVar60 >> 7) & 1);
                auVar83._28_4_ = (uint)bVar48 * auVar74._28_4_ | (uint)!bVar48 * auVar72._28_4_;
                bVar48 = (bool)((byte)(uVar60 >> 8) & 1);
                auVar83._32_4_ = (uint)bVar48 * auVar74._32_4_ | (uint)!bVar48 * auVar72._32_4_;
                bVar48 = (bool)((byte)(uVar60 >> 9) & 1);
                auVar83._36_4_ = (uint)bVar48 * auVar74._36_4_ | (uint)!bVar48 * auVar72._36_4_;
                bVar48 = (bool)((byte)(uVar60 >> 10) & 1);
                auVar83._40_4_ = (uint)bVar48 * auVar74._40_4_ | (uint)!bVar48 * auVar72._40_4_;
                bVar48 = (bool)((byte)(uVar60 >> 0xb) & 1);
                auVar83._44_4_ = (uint)bVar48 * auVar74._44_4_ | (uint)!bVar48 * auVar72._44_4_;
                bVar48 = (bool)((byte)(uVar60 >> 0xc) & 1);
                auVar83._48_4_ = (uint)bVar48 * auVar74._48_4_ | (uint)!bVar48 * auVar72._48_4_;
                bVar48 = (bool)((byte)(uVar60 >> 0xd) & 1);
                auVar83._52_4_ = (uint)bVar48 * auVar74._52_4_ | (uint)!bVar48 * auVar72._52_4_;
                bVar48 = (bool)((byte)(uVar60 >> 0xe) & 1);
                auVar83._56_4_ = (uint)bVar48 * auVar74._56_4_ | (uint)!bVar48 * auVar72._56_4_;
                bVar48 = SUB81(uVar60 >> 0xf,0);
                auVar83._60_4_ = (uint)bVar48 * auVar74._60_4_ | (uint)!bVar48 * auVar72._60_4_;
                uVar23 = uVar52;
                if (uVar58 != 8) {
                  *puVar57 = uVar58;
                  puVar57 = puVar57 + 1;
                  *pauVar55 = auVar71;
                  pauVar55 = pauVar55 + 1;
                }
              }
              auVar71 = auVar83;
              uVar58 = uVar23;
              lVar54 = lVar54 + 4;
            } while (lVar54 != 0);
            if (uVar58 == 8) goto LAB_00822be6;
            uVar25 = vcmpps_avx512f(auVar71,local_9f80,9);
            root.ptr = uVar58;
            local_a780 = auVar71;
          } while ((ushort)uVar59 < (ushort)POPCOUNT((int)uVar25));
          *puVar57 = uVar58;
          puVar57 = puVar57 + 1;
          *pauVar55 = auVar71;
          pauVar55 = pauVar55 + 1;
LAB_00822be6:
          iVar61 = 4;
        }
        else {
          local_a680._0_8_ = uVar51;
          do {
            k = 0;
            for (uVar51 = uVar58; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
            in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            bVar48 = occluded1(local_a7a0,local_a7a8,root,k,&local_a839,ray,
                               (TravRayK<16,_true> *)&local_a2c0.field_0,context);
            uVar50 = 1 << ((uint)k & 0x1f);
            if (!bVar48) {
              uVar50 = 0;
            }
            local_a864 = local_a864 | uVar50;
            uVar58 = uVar58 - 1 & uVar58;
          } while (uVar58 != 0);
          iVar61 = 3;
          if ((short)local_a864 != -1) {
            auVar66 = vbroadcastss_avx512f(ZEXT416(0xff800000));
            bVar48 = (bool)((byte)local_a864 & 1);
            local_9f80._0_4_ = (uint)bVar48 * auVar66._0_4_ | (uint)!bVar48 * local_9f80._0_4_;
            bVar48 = (bool)((byte)(local_a864 >> 1) & 1);
            local_9f80._4_4_ = (uint)bVar48 * auVar66._4_4_ | (uint)!bVar48 * local_9f80._4_4_;
            bVar48 = (bool)((byte)(local_a864 >> 2) & 1);
            local_9f80._8_4_ = (uint)bVar48 * auVar66._8_4_ | (uint)!bVar48 * local_9f80._8_4_;
            bVar48 = (bool)((byte)(local_a864 >> 3) & 1);
            local_9f80._12_4_ = (uint)bVar48 * auVar66._12_4_ | (uint)!bVar48 * local_9f80._12_4_;
            bVar48 = (bool)((byte)(local_a864 >> 4) & 1);
            local_9f80._16_4_ = (uint)bVar48 * auVar66._16_4_ | (uint)!bVar48 * local_9f80._16_4_;
            bVar48 = (bool)((byte)(local_a864 >> 5) & 1);
            local_9f80._20_4_ = (uint)bVar48 * auVar66._20_4_ | (uint)!bVar48 * local_9f80._20_4_;
            bVar48 = (bool)((byte)(local_a864 >> 6) & 1);
            local_9f80._24_4_ = (uint)bVar48 * auVar66._24_4_ | (uint)!bVar48 * local_9f80._24_4_;
            bVar48 = (bool)((byte)(local_a864 >> 7) & 1);
            local_9f80._28_4_ = (uint)bVar48 * auVar66._28_4_ | (uint)!bVar48 * local_9f80._28_4_;
            bVar48 = (bool)((byte)(local_a864 >> 8) & 1);
            local_9f80._32_4_ = (uint)bVar48 * auVar66._32_4_ | (uint)!bVar48 * local_9f80._32_4_;
            bVar48 = (bool)((byte)(local_a864 >> 9) & 1);
            local_9f80._36_4_ = (uint)bVar48 * auVar66._36_4_ | (uint)!bVar48 * local_9f80._36_4_;
            bVar48 = (bool)((byte)(local_a864 >> 10) & 1);
            local_9f80._40_4_ = (uint)bVar48 * auVar66._40_4_ | (uint)!bVar48 * local_9f80._40_4_;
            bVar48 = (bool)((byte)(local_a864 >> 0xb) & 1);
            local_9f80._44_4_ = (uint)bVar48 * auVar66._44_4_ | (uint)!bVar48 * local_9f80._44_4_;
            bVar48 = (bool)((byte)(local_a864 >> 0xc) & 1);
            local_9f80._48_4_ = (uint)bVar48 * auVar66._48_4_ | (uint)!bVar48 * local_9f80._48_4_;
            bVar48 = (bool)((byte)(local_a864 >> 0xd) & 1);
            local_9f80._52_4_ = (uint)bVar48 * auVar66._52_4_ | (uint)!bVar48 * local_9f80._52_4_;
            bVar48 = (bool)((byte)(local_a864 >> 0xe) & 1);
            local_9f80._56_4_ = (uint)bVar48 * auVar66._56_4_ | (uint)!bVar48 * local_9f80._56_4_;
            bVar48 = (bool)((byte)(local_a864 >> 0xf) & 1);
            local_9f80._60_4_ = (uint)bVar48 * auVar66._60_4_ | (uint)!bVar48 * local_9f80._60_4_;
            iVar61 = 2;
          }
          auVar67 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
          auVar69 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar66 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
          auVar68 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
          auVar117 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
          auVar62 = vxorps_avx512vl(auVar70._0_16_,auVar70._0_16_);
          auVar70 = ZEXT1664(auVar62);
          if ((uint)uVar59 < (uint)local_a680._0_4_) goto LAB_008229c4;
        }
      } while (iVar61 != 3);
LAB_008240e3:
      local_a864 = local_a864 & local_a804;
      auVar66 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      bVar48 = (bool)((byte)local_a864 & 1);
      bVar7 = (bool)((byte)(local_a864 >> 1) & 1);
      bVar8 = (bool)((byte)(local_a864 >> 2) & 1);
      bVar9 = (bool)((byte)(local_a864 >> 3) & 1);
      bVar10 = (bool)((byte)(local_a864 >> 4) & 1);
      bVar11 = (bool)((byte)(local_a864 >> 5) & 1);
      bVar12 = (bool)((byte)(local_a864 >> 6) & 1);
      bVar13 = (bool)((byte)(local_a864 >> 7) & 1);
      bVar15 = (bool)((byte)(local_a864 >> 8) & 1);
      bVar16 = (bool)((byte)(local_a864 >> 9) & 1);
      bVar17 = (bool)((byte)(local_a864 >> 10) & 1);
      bVar18 = (bool)((byte)(local_a864 >> 0xb) & 1);
      bVar19 = (bool)((byte)(local_a864 >> 0xc) & 1);
      bVar20 = (bool)((byte)(local_a864 >> 0xd) & 1);
      bVar21 = (bool)((byte)(local_a864 >> 0xe) & 1);
      bVar22 = (bool)((byte)(local_a864 >> 0xf) & 1);
      *(uint *)local_a810 = (uint)bVar48 * auVar66._0_4_ | (uint)!bVar48 * *(int *)local_a810;
      *(uint *)(local_a810 + 4) =
           (uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * *(int *)(local_a810 + 4);
      *(uint *)(local_a810 + 8) =
           (uint)bVar8 * auVar66._8_4_ | (uint)!bVar8 * *(int *)(local_a810 + 8);
      *(uint *)(local_a810 + 0xc) =
           (uint)bVar9 * auVar66._12_4_ | (uint)!bVar9 * *(int *)(local_a810 + 0xc);
      *(uint *)(local_a810 + 0x10) =
           (uint)bVar10 * auVar66._16_4_ | (uint)!bVar10 * *(int *)(local_a810 + 0x10);
      *(uint *)(local_a810 + 0x14) =
           (uint)bVar11 * auVar66._20_4_ | (uint)!bVar11 * *(int *)(local_a810 + 0x14);
      *(uint *)(local_a810 + 0x18) =
           (uint)bVar12 * auVar66._24_4_ | (uint)!bVar12 * *(int *)(local_a810 + 0x18);
      *(uint *)(local_a810 + 0x1c) =
           (uint)bVar13 * auVar66._28_4_ | (uint)!bVar13 * *(int *)(local_a810 + 0x1c);
      *(uint *)(local_a810 + 0x20) =
           (uint)bVar15 * auVar66._32_4_ | (uint)!bVar15 * *(int *)(local_a810 + 0x20);
      *(uint *)(local_a810 + 0x24) =
           (uint)bVar16 * auVar66._36_4_ | (uint)!bVar16 * *(int *)(local_a810 + 0x24);
      *(uint *)(local_a810 + 0x28) =
           (uint)bVar17 * auVar66._40_4_ | (uint)!bVar17 * *(int *)(local_a810 + 0x28);
      *(uint *)(local_a810 + 0x2c) =
           (uint)bVar18 * auVar66._44_4_ | (uint)!bVar18 * *(int *)(local_a810 + 0x2c);
      *(uint *)(local_a810 + 0x30) =
           (uint)bVar19 * auVar66._48_4_ | (uint)!bVar19 * *(int *)(local_a810 + 0x30);
      *(uint *)(local_a810 + 0x34) =
           (uint)bVar20 * auVar66._52_4_ | (uint)!bVar20 * *(int *)(local_a810 + 0x34);
      *(uint *)(local_a810 + 0x38) =
           (uint)bVar21 * auVar66._56_4_ | (uint)!bVar21 * *(int *)(local_a810 + 0x38);
      *(uint *)(local_a810 + 0x3c) =
           (uint)bVar22 * auVar66._60_4_ | (uint)!bVar22 * *(int *)(local_a810 + 0x3c);
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }